

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *atlas)

{
  ImBitVector *this;
  uint *puVar1;
  stbtt_uint8 sVar2;
  byte bVar3;
  ImWchar IVar4;
  ushort uVar5;
  uint uVar6;
  ImFont *pIVar7;
  ImFont **ppIVar8;
  stbtt_uint8 *data;
  undefined8 *puVar9;
  ImFontConfig *pIVar10;
  long lVar11;
  stbrp_node *psVar12;
  stbtt__buf fontdict;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 ptr;
  size_t sVar15;
  bool bVar16;
  ushort uVar17;
  short sVar18;
  stbtt_uint32 sVar19;
  stbtt_uint32 sVar25;
  uint uVar26;
  int iVar27;
  int iVar28;
  stbtt__active_edge *z;
  stbtt_uint32 sVar20;
  stbtt_uint32 sVar21;
  stbtt_uint32 sVar22;
  stbtt_uint32 sVar23;
  stbtt_uint32 sVar24;
  ulong uVar29;
  int *piVar30;
  void *pvVar31;
  long lVar32;
  void *pvVar33;
  stbrp_context *ptr_00;
  uchar *puVar34;
  stbtt__point *points;
  stbtt__edge *p_00;
  stbtt__buf *scanline;
  stbtt__buf *psVar35;
  undefined1 auVar36 [8];
  undefined8 *puVar37;
  short sVar38;
  int iVar39;
  long lVar40;
  ImWchar *pIVar41;
  uint *puVar42;
  stbtt__active_edge *psVar43;
  stbtt__active_edge *psVar44;
  char *__function;
  long lVar45;
  ulong uVar46;
  size_t sVar47;
  byte *pbVar48;
  ImFontAtlas *atlas_00;
  uint uVar49;
  ushort *puVar50;
  uchar uVar51;
  ulong uVar52;
  ulong uVar53;
  size_t size;
  byte *pbVar54;
  ImFontConfig *pIVar55;
  long lVar56;
  int iVar57;
  ImU32 bit_n;
  uint uVar58;
  stbtt__edge *psVar59;
  byte bVar60;
  int iVar61;
  uint uVar62;
  void *p;
  stbtt_fontinfo *psVar63;
  long lVar64;
  stbtt__active_edge *psVar65;
  bool bVar66;
  float fVar67;
  float fVar68;
  undefined4 uVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float in_XMM3_Da;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  stbtt__buf sVar78;
  float y0_2;
  int y1;
  stbtt_uint32 charstrings;
  ImVector<stbrp_rect> buf_rects;
  ImVector<stbtt_packedchar> buf_packedchars;
  stbtt_uint32 fdarrayoff;
  int y0_1;
  int x0_1;
  int iy0;
  int x1_1;
  stbtt__buf b;
  undefined8 in_stack_fffffffffffffb50;
  undefined4 in_stack_fffffffffffffb5c;
  int iVar79;
  void *local_490;
  ImFontAtlas *atlas_01;
  undefined4 uVar80;
  float local_478;
  int local_450;
  stbtt_uint32 local_44c;
  void *local_448;
  undefined1 local_440 [8];
  undefined1 local_438 [16];
  undefined1 local_428 [16];
  ulong local_410;
  ulong local_408;
  int local_3fc;
  void *local_3f8;
  stbtt__active_edge *local_3f0;
  undefined8 local_3e8;
  void *pvStack_3e0;
  stbrp_node *local_3d0;
  ulong local_3c8;
  undefined8 local_3c0;
  float local_3b4;
  float local_3b0;
  uint local_3ac;
  ulong local_3a8;
  undefined4 uStack_3a0;
  undefined4 uStack_39c;
  stbtt_fontinfo *local_390;
  undefined8 *local_388;
  float local_380;
  float local_37c;
  int local_378;
  float local_374;
  long local_370;
  long local_368;
  ulong local_360;
  uchar *local_358;
  stbtt__point *local_350;
  uchar *local_348;
  ulong local_340;
  ulong local_338;
  float *local_330;
  size_t local_328;
  float local_320;
  float local_31c;
  uint local_318;
  uint local_314;
  int local_310;
  int local_30c;
  float local_308;
  int local_304;
  int local_300;
  int local_2fc;
  undefined1 local_2f8 [16];
  stbrp_context *local_2e8;
  float *local_2e0;
  float local_2d8;
  undefined4 uStack_2d4;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  size_t local_2c0;
  ImFontConfig *local_2b8;
  long local_2b0;
  short *local_2a8;
  long local_2a0;
  ulong local_298;
  ulong local_290;
  long local_288;
  size_t local_280;
  size_t local_278;
  int local_270;
  int local_26c;
  undefined1 local_268 [16];
  stbtt__buf local_258 [33];
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  if ((atlas->ConfigData).Size < 1) {
    __assert_fail("atlas->ConfigData.Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui_draw.cpp"
                  ,0x79d,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
  }
  ImFontAtlasBuildInit(atlas);
  atlas->TexID = (ImTextureID)0x0;
  atlas->TexWidth = 0;
  atlas->TexHeight = 0;
  (atlas->TexUvScale).x = 0.0;
  (atlas->TexUvScale).y = 0.0;
  local_490 = (void *)0x0;
  (atlas->TexUvWhitePixel).x = 0.0;
  (atlas->TexUvWhitePixel).y = 0.0;
  ImFontAtlas::ClearTexData(atlas);
  uVar6 = (atlas->ConfigData).Size;
  lVar40 = (long)(int)uVar6;
  if (0 < lVar40) {
    uVar29 = 8;
    if (8 < (int)uVar6) {
      uVar29 = (ulong)uVar6;
    }
    local_490 = ImGui::MemAlloc(uVar29 * 0x110);
  }
  uVar26 = (atlas->Fonts).Size;
  uVar29 = (ulong)(int)uVar26;
  if ((long)uVar29 < 1) {
    local_3f8 = (void *)0x0;
  }
  else {
    uVar52 = 8;
    if (8 < (int)uVar26) {
      uVar52 = (ulong)uVar26;
    }
    local_3f8 = ImGui::MemAlloc(uVar52 << 5);
  }
  local_2c0 = lVar40 * 0x110;
  memset(local_490,0,local_2c0);
  local_328 = uVar29 << 5;
  memset(local_3f8,0,local_328);
  uVar26 = (atlas->ConfigData).Size;
  uVar52 = (ulong)uVar26;
  iVar79 = CONCAT13((int)uVar26 < 1,(int3)in_stack_fffffffffffffb5c);
  local_3a8 = uVar29;
  if (0 < (int)uVar26) {
    uVar29 = 0;
    if (0 < (int)uVar6) {
      uVar29 = (ulong)uVar6;
    }
    local_2f8._0_8_ = uVar29;
    lVar56 = 0;
    do {
      if (lVar56 == local_2f8._0_8_) {
        __function = "T &ImVector<ImFontBuildSrcData>::operator[](int) [T = ImFontBuildSrcData]";
        goto LAB_001334e3;
      }
      if ((int)uVar52 <= lVar56) goto LAB_0013354a;
      pIVar55 = (atlas->ConfigData).Data;
      pIVar7 = pIVar55[lVar56].DstFont;
      if ((pIVar7 == (ImFont *)0x0) ||
         (pIVar7->ContainerAtlas != atlas && pIVar7->ContainerAtlas != (ImFontAtlas *)0x0)) {
        __assert_fail("cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui_draw.cpp"
                      ,0x7b5,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      *(undefined4 *)((long)local_490 + lVar56 * 0x110 + 0xe0) = 0xffffffff;
      uVar29 = (ulong)(atlas->Fonts).Size;
      if ((long)uVar29 < 1) {
LAB_0013359a:
        __assert_fail("src_tmp.DstIndex != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui_draw.cpp"
                      ,0x7bc,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      pIVar55 = pIVar55 + lVar56;
      ppIVar8 = (atlas->Fonts).Data;
      uVar53 = 0xffffffff;
      uVar52 = 0;
      do {
        if (pIVar7 == ppIVar8[uVar52]) {
          *(int *)((long)local_490 + lVar56 * 0x110 + 0xe0) = (int)uVar52;
          uVar53 = uVar52 & 0xffffffff;
        }
        uVar52 = uVar52 + 1;
      } while ((uVar52 < uVar29) && ((int)uVar53 == -1));
      if ((int)uVar53 == -1) goto LAB_0013359a;
      uVar69 = (undefined4)lVar56;
      iVar27 = (int)((ulong)lVar56 >> 0x20);
      data = (stbtt_uint8 *)pIVar55->FontData;
      iVar61 = pIVar55->FontNo;
      sVar2 = *data;
      if (((((sVar2 == '1') && (data[1] == '\0')) && (data[2] == '\0')) && (data[3] == '\0')) ||
         (((sVar2 == 't' && (data[1] == 'y')) && ((data[2] == 'p' && (data[3] == '1')))))) {
LAB_001304bd:
        sVar25 = -(uint)(iVar61 != 0);
      }
      else {
        if (sVar2 == '\0') {
          if (((data[1] != '\x01') || (data[2] != '\0')) || (data[3] != '\0')) goto LAB_00130495;
          goto LAB_001304bd;
        }
        if ((((sVar2 == 'O') && (data[1] == 'T')) && (data[2] == 'T')) && (data[3] == 'O'))
        goto LAB_001304bd;
LAB_00130495:
        sVar25 = 0xffffffff;
        if (sVar2 == 't') {
          if (data[1] == 't') {
            if ((data[2] == 'c') && (data[3] == 'f')) {
              uVar26 = *(uint *)(data + 4);
              uVar26 = uVar26 >> 0x18 | (uVar26 & 0xff0000) >> 8 | (uVar26 & 0xff00) << 8 |
                       uVar26 << 0x18;
              if (((uVar26 == 0x20000) || (uVar26 == 0x10000)) &&
                 (uVar26 = *(uint *)(data + 8),
                 iVar61 < (int)(uVar26 >> 0x18 | (uVar26 & 0xff0000) >> 8 | (uVar26 & 0xff00) << 8 |
                               uVar26 << 0x18))) {
                uVar26 = *(uint *)(data + (long)iVar61 * 4 + 0xc);
                sVar25 = uVar26 >> 0x18 | (uVar26 & 0xff0000) >> 8 | (uVar26 & 0xff00) << 8 |
                         uVar26 << 0x18;
              }
            }
          }
          else if (((data[1] == 'r') && (data[2] == 'u')) && (data[3] == 'e')) goto LAB_001304bd;
        }
      }
      if ((int)sVar25 < 0) {
        __assert_fail("font_offset >= 0 && \"FontData is incorrect, or FontNo cannot be found.\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui_draw.cpp"
                      ,0x7c2,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      *(stbtt_uint8 **)((long)local_490 + lVar56 * 0x110 + 8) = data;
      *(stbtt_uint32 *)((long)local_490 + lVar56 * 0x110 + 0x10) = sVar25;
      *(undefined8 *)((long)local_490 + lVar56 * 0x110 + 0x40) = 0;
      *(undefined8 *)((long)local_490 + lVar56 * 0x110 + 0x48) = 0;
      sVar19 = stbtt__find_table(data,sVar25,"cmap");
      sVar20 = stbtt__find_table(data,sVar25,"loca");
      *(stbtt_uint32 *)((long)local_490 + lVar56 * 0x110 + 0x18) = sVar20;
      sVar21 = stbtt__find_table(data,sVar25,"head");
      local_428._0_4_ = sVar21;
      *(stbtt_uint32 *)((long)local_490 + lVar56 * 0x110 + 0x1c) = sVar21;
      sVar21 = stbtt__find_table(data,sVar25,"glyf");
      *(stbtt_uint32 *)((long)local_490 + lVar56 * 0x110 + 0x20) = sVar21;
      sVar22 = stbtt__find_table(data,sVar25,"hhea");
      *(stbtt_uint32 *)((long)local_490 + lVar56 * 0x110 + 0x24) = sVar22;
      sVar23 = stbtt__find_table(data,sVar25,"hmtx");
      *(stbtt_uint32 *)((long)local_490 + lVar56 * 0x110 + 0x28) = sVar23;
      sVar24 = stbtt__find_table(data,sVar25,"kern");
      *(stbtt_uint32 *)((long)local_490 + lVar56 * 0x110 + 0x2c) = sVar24;
      sVar24 = stbtt__find_table(data,sVar25,"GPOS");
      *(stbtt_uint32 *)((long)local_490 + lVar56 * 0x110 + 0x30) = sVar24;
      if ((((sVar19 == 0) || ((float)local_428._0_4_ == 0.0)) || (sVar22 == 0)) || (sVar23 == 0))
      goto LAB_001333bc;
      if (sVar21 == 0) {
        local_3e8 = CONCAT44(local_3e8._4_4_,2);
        local_440 = (undefined1  [8])((ulong)local_440 & 0xffffffff00000000);
        local_3c0._0_4_ = 0;
        local_44c = 0;
        sVar21 = stbtt__find_table(data,sVar25,"CFF ");
        if (sVar21 == 0) goto LAB_001333bc;
        *(undefined8 *)((long)local_490 + lVar56 * 0x110 + 0x90) = 0;
        *(undefined8 *)((long)local_490 + lVar56 * 0x110 + 0x98) = 0;
        *(undefined8 *)((long)local_490 + lVar56 * 0x110 + 0x80) = 0;
        *(undefined8 *)((long)local_490 + lVar56 * 0x110 + 0x88) = 0;
        *(stbtt_uint8 **)((long)local_490 + lVar56 * 0x110 + 0x40) = data + sVar21;
        *(undefined8 *)((long)local_490 + lVar56 * 0x110 + 0x48) = 0x2000000000000000;
        local_258[0].data = *(uchar **)((long)local_490 + lVar56 * 0x110 + 0x40);
        local_258[0]._8_8_ = *(undefined8 *)((long)local_490 + lVar56 * 0x110 + 0x48);
        if ((long)local_258[0].cursor < -2) {
LAB_0013360c:
          __assert_fail("!(o > b->size || o < 0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imstb_truetype.h"
                        ,0x46c,"void stbtt__buf_seek(stbtt__buf *, int)");
        }
        lVar32 = (long)local_258[0].cursor + 2;
        iVar61 = (int)lVar32;
        if (local_258[0].size < iVar61) goto LAB_0013360c;
        uVar26 = 0;
        if (iVar61 < local_258[0].size) {
          iVar61 = local_258[0].cursor + 3;
          uVar26 = (uint)local_258[0].data[lVar32];
        }
        local_258[0].cursor = iVar61;
        if (local_258[0].size < (int)uVar26) goto LAB_0013360c;
        local_258[0].cursor = uVar26;
        stbtt__cff_get_index(local_258);
        sVar78 = stbtt__cff_get_index(local_258);
        local_438 = (undefined1  [16])stbtt__cff_index_get(sVar78,0);
        stbtt__cff_get_index(local_258);
        sVar78 = stbtt__cff_get_index(local_258);
        *(stbtt__buf *)((long)local_490 + lVar56 * 0x110 + 0x60) = sVar78;
        stbtt__dict_get_ints((stbtt__buf *)local_438,0x11,1,(stbtt_uint32 *)local_440);
        stbtt__dict_get_ints((stbtt__buf *)local_438,0x106,1,(stbtt_uint32 *)&local_3e8);
        stbtt__dict_get_ints((stbtt__buf *)local_438,0x124,1,(stbtt_uint32 *)&local_3c0);
        stbtt__dict_get_ints((stbtt__buf *)local_438,0x125,1,&local_44c);
        sVar78.cursor = sVar20;
        sVar78.data = (uchar *)in_stack_fffffffffffffb50;
        sVar78.size = iVar79;
        fontdict.cursor = uVar69;
        fontdict.data = &atlas->Locked;
        fontdict.size = iVar27;
        sVar78 = stbtt__get_subrs(sVar78,fontdict);
        sVar20 = local_44c;
        *(stbtt__buf *)((long)local_490 + lVar56 * 0x110 + 0x70) = sVar78;
        if (((stbtt_uint32)local_3e8 != 2) || (uVar80 = local_440._0_4_, local_440._0_4_ == 0))
        goto LAB_001333bc;
        if ((stbtt_uint32)local_3c0 != 0) {
          uVar29 = (ulong)local_44c;
          if (uVar29 == 0) goto LAB_001333bc;
          if (((int)(stbtt_uint32)local_3c0 < 0) ||
             (local_258[0].size < (int)(stbtt_uint32)local_3c0)) goto LAB_0013360c;
          local_258[0].cursor = (stbtt_uint32)local_3c0;
          sVar78 = stbtt__cff_get_index(local_258);
          *(stbtt__buf *)((long)local_490 + lVar56 * 0x110 + 0x80) = sVar78;
          puVar34 = local_258[0].data + uVar29;
          lVar32 = (ulong)(local_258[0].size - sVar20) << 0x20;
          if ((int)(local_258[0].size - sVar20 | sVar20) < 0 || local_258[0].size < (int)sVar20) {
            puVar34 = (uchar *)0x0;
            lVar32 = 0;
          }
          *(uchar **)((long)local_490 + lVar56 * 0x110 + 0x90) = puVar34;
          *(long *)((long)local_490 + lVar56 * 0x110 + 0x98) = lVar32;
        }
        if (((int)uVar80 < 0) || (local_258[0].size < (int)uVar80)) goto LAB_0013360c;
        local_258[0].cursor = uVar80;
        sVar78 = stbtt__cff_get_index(local_258);
        *(stbtt__buf *)((long)local_490 + lVar56 * 0x110 + 0x50) = sVar78;
      }
      else if (sVar20 == 0) goto LAB_001333bc;
      sVar25 = stbtt__find_table(data,sVar25,"maxp");
      if (sVar25 == 0) {
        uVar26 = 0xffff;
      }
      else {
        uVar26 = (uint)(ushort)(*(ushort *)(data + (ulong)sVar25 + 4) << 8 |
                               *(ushort *)(data + (ulong)sVar25 + 4) >> 8);
      }
      *(uint *)((long)local_490 + lVar56 * 0x110 + 0x14) = uVar26;
      uVar17 = *(ushort *)(data + (ulong)sVar19 + 2) << 8 |
               *(ushort *)(data + (ulong)sVar19 + 2) >> 8;
      *(undefined4 *)((long)local_490 + lVar56 * 0x110 + 0x34) = 0;
      if (uVar17 != 0) {
        uVar26 = sVar19 + 4;
        uVar29 = (ulong)uVar17;
        do {
          uVar17 = *(ushort *)(data + uVar26) << 8 | *(ushort *)(data + uVar26) >> 8;
          if ((uVar17 == 0) ||
             ((uVar17 == 3 &&
              ((uVar17 = *(ushort *)(data + (ulong)uVar26 + 2) << 8 |
                         *(ushort *)(data + (ulong)uVar26 + 2) >> 8, uVar17 == 10 || (uVar17 == 1)))
              ))) {
            uVar49 = *(uint *)(data + (ulong)uVar26 + 4);
            *(uint *)((long)local_490 + lVar56 * 0x110 + 0x34) =
                 (uVar49 >> 0x18 | (uVar49 & 0xff0000) >> 8 | (uVar49 & 0xff00) << 8 |
                 uVar49 << 0x18) + sVar19;
          }
          uVar26 = uVar26 + 8;
          uVar29 = uVar29 - 1;
        } while (uVar29 != 0);
      }
      if (*(int *)((long)local_490 + lVar56 * 0x110 + 0x34) == 0) goto LAB_001333bc;
      *(uint *)((long)local_490 + lVar56 * 0x110 + 0x38) =
           (uint)(ushort)(*(ushort *)
                           (data + (long)*(int *)((long)local_490 + lVar56 * 0x110 + 0x1c) + 0x32)
                          << 8 | *(ushort *)
                                  (data + (long)*(int *)((long)local_490 + lVar56 * 0x110 + 0x1c) +
                                          0x32) >> 8);
      iVar61 = *(int *)((long)local_490 + lVar56 * 0x110 + 0xe0);
      if ((int)local_3a8 <= iVar61) goto LAB_00133561;
      pIVar41 = pIVar55->GlyphRanges;
      if (pIVar41 == (ImWchar *)0x0) {
        pIVar41 = ImFontAtlas::GetGlyphRangesDefault::ranges;
      }
      *(ImWchar **)((long)local_490 + lVar56 * 0x110 + 0xd8) = pIVar41;
      IVar4 = *pIVar41;
      while (IVar4 != 0) {
        uVar17 = pIVar41[1];
        if (uVar17 == 0) break;
        uVar26 = *(uint *)((long)local_490 + lVar56 * 0x110 + 0xe4);
        uVar49 = (uint)uVar17;
        if ((int)(uint)uVar17 < (int)uVar26) {
          uVar49 = uVar26;
        }
        *(uint *)((long)local_490 + lVar56 * 0x110 + 0xe4) = uVar49;
        IVar4 = pIVar41[2];
        pIVar41 = pIVar41 + 2;
      }
      piVar30 = (int *)((long)iVar61 * 0x20 + (long)local_3f8);
      *piVar30 = *piVar30 + 1;
      iVar61 = *(int *)((long)local_490 + lVar56 * 0x110 + 0xe4);
      if (iVar61 < piVar30[1]) {
        iVar61 = piVar30[1];
      }
      piVar30[1] = iVar61;
      lVar56 = CONCAT44(iVar27,uVar69) + 1;
      uVar52 = (ulong)(atlas->ConfigData).Size;
      iVar79 = CONCAT13((long)uVar52 <= lVar56,(int3)iVar79);
    } while (lVar56 < (long)uVar52);
  }
  uVar26 = 0;
  if (0 < (int)uVar6) {
    lVar56 = 0;
    uVar26 = 0;
    do {
      iVar61 = *(int *)((long)local_490 + lVar56 * 0x110 + 0xe0);
      if ((int)local_3a8 <= iVar61) goto LAB_00133561;
      local_428._0_8_ = lVar56;
      psVar63 = (stbtt_fontinfo *)(lVar56 * 0x110 + (long)local_490);
      ImBitVector::Create((ImBitVector *)&psVar63[1].charstrings,
                          *(int *)((long)&psVar63[1].cff.data + 4) + 1);
      pvVar33 = local_3f8;
      this = (ImBitVector *)((long)local_3f8 + (long)iVar61 * 0x20 + 0x10);
      if (*(int *)((long)local_3f8 + (long)iVar61 * 0x20 + 0x10) == 0) {
        ImBitVector::Create(this,*(int *)((long)local_3f8 + (long)iVar61 * 0x20 + 4) + 1);
      }
      puVar50 = *(ushort **)&psVar63[1].indexToLocFormat;
      uVar17 = *puVar50;
      for (; (uVar49 = (uint)uVar17, uVar17 != 0 && (puVar50[1] != 0)); puVar50 = puVar50 + 2) {
        if (uVar17 <= puVar50[1]) {
          do {
            bVar16 = ImBitVector::TestBit(this,uVar49);
            if ((!bVar16) && (iVar27 = stbtt_FindGlyphIndex(psVar63,uVar49), iVar27 != 0)) {
              piVar30 = &psVar63[1].cff.cursor;
              *piVar30 = *piVar30 + 1;
              piVar30 = (int *)((long)pvVar33 + (long)iVar61 * 0x20 + 8);
              *piVar30 = *piVar30 + 1;
              ImBitVector::SetBit((ImBitVector *)&psVar63[1].charstrings,uVar49);
              ImBitVector::SetBit(this,uVar49);
              uVar26 = uVar26 + 1;
            }
            bVar16 = uVar49 < puVar50[1];
            uVar49 = uVar49 + 1;
          } while (bVar16);
        }
        uVar17 = puVar50[2];
      }
      lVar56 = local_428._0_8_ + 1;
    } while (lVar56 != lVar40);
  }
  if (0 < (int)uVar6) {
    lVar56 = 0;
    do {
      uVar69 = (undefined4)lVar56;
      uVar80 = (undefined4)((ulong)lVar56 >> 0x20);
      lVar56 = lVar56 * 0x110;
      iVar61 = *(int *)((long)local_490 + lVar56 + 0xe8);
      if (*(int *)((long)local_490 + lVar56 + 0x104) < iVar61) {
        pvVar31 = ImGui::MemAlloc((long)iVar61 << 2);
        pvVar33 = *(void **)((long)local_490 + lVar56 + 0x108);
        if (pvVar33 != (void *)0x0) {
          memcpy(pvVar31,pvVar33,(long)*(int *)((long)local_490 + lVar56 + 0x100) << 2);
          ImGui::MemFree(*(void **)((long)local_490 + lVar56 + 0x108));
        }
        *(void **)((long)local_490 + lVar56 + 0x108) = pvVar31;
        *(int *)((long)local_490 + lVar56 + 0x104) = iVar61;
      }
      lVar32 = (long)*(int *)((long)local_490 + lVar56 + 0xf0);
      if (0 < lVar32) {
        puVar42 = *(uint **)((long)local_490 + lVar56 + 0xf8);
        puVar1 = puVar42 + lVar32;
        iVar61 = 0;
        do {
          local_428._0_8_ = puVar42;
          uVar49 = *puVar42;
          if (uVar49 != 0) {
            uVar58 = 0;
            do {
              if ((uVar49 >> (uVar58 & 0x1f) & 1) != 0) {
                iVar27 = *(int *)((long)local_490 + lVar56 + 0x100);
                iVar57 = *(int *)((long)local_490 + lVar56 + 0x104);
                if (iVar27 == iVar57) {
                  if (iVar57 == 0) {
                    iVar39 = 8;
                  }
                  else {
                    iVar39 = iVar57 / 2 + iVar57;
                  }
                  iVar27 = iVar27 + 1;
                  if (iVar27 < iVar39) {
                    iVar27 = iVar39;
                  }
                  if (iVar57 < iVar27) {
                    pvVar31 = ImGui::MemAlloc((long)iVar27 << 2);
                    pvVar33 = *(void **)((long)local_490 + lVar56 + 0x108);
                    if (pvVar33 != (void *)0x0) {
                      memcpy(pvVar31,pvVar33,(long)*(int *)((long)local_490 + lVar56 + 0x100) << 2);
                      ImGui::MemFree(*(void **)((long)local_490 + lVar56 + 0x108));
                    }
                    *(void **)((long)local_490 + lVar56 + 0x108) = pvVar31;
                    *(int *)((long)local_490 + lVar56 + 0x104) = iVar27;
                  }
                }
                *(uint *)(*(long *)((long)local_490 + lVar56 + 0x108) +
                         (long)*(int *)((long)local_490 + lVar56 + 0x100) * 4) = iVar61 + uVar58;
                piVar30 = (int *)((long)local_490 + lVar56 + 0x100);
                *piVar30 = *piVar30 + 1;
              }
              uVar58 = uVar58 + 1;
            } while (uVar58 != 0x20);
          }
          puVar42 = (uint *)(local_428._0_8_ + 4);
          iVar61 = iVar61 + 0x20;
        } while (puVar42 < puVar1);
      }
      pvVar33 = *(void **)((long)local_490 + lVar56 + 0xf8);
      if (pvVar33 != (void *)0x0) {
        *(undefined8 *)((long)local_490 + lVar56 + 0xf0) = 0;
        ImGui::MemFree(pvVar33);
        *(undefined8 *)((long)local_490 + lVar56 + 0xf8) = 0;
      }
      if (*(int *)((long)local_490 + lVar56 + 0x100) != *(int *)((long)local_490 + lVar56 + 0xe8)) {
        __assert_fail("src_tmp.GlyphsList.Size == src_tmp.GlyphsCount",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui_draw.cpp"
                      ,0x7f1,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      lVar56 = CONCAT44(uVar80,uVar69) + 1;
    } while (lVar56 != lVar40);
  }
  sVar15 = local_328;
  pvVar33 = local_3f8;
  if (0 < (int)(float)local_3a8) {
    sVar47 = 0;
    do {
      pvVar31 = *(void **)((long)pvVar33 + sVar47 + 0x18);
      if (pvVar31 != (void *)0x0) {
        *(undefined8 *)((long)pvVar33 + sVar47 + 0x10) = 0;
        ImGui::MemFree(pvVar31);
        *(undefined8 *)((long)pvVar33 + sVar47 + 0x18) = 0;
      }
      sVar47 = sVar47 + 0x20;
    } while (sVar15 != sVar47);
  }
  if (local_3f8 != (void *)0x0) {
    ImGui::MemFree(local_3f8);
    local_3f8 = (void *)0x0;
  }
  local_438 = ZEXT816(0);
  local_3e8 = 0;
  pvStack_3e0 = (void *)0x0;
  if (0 < (int)uVar26) {
    uVar49 = 8;
    if (7 < (int)uVar26) {
      uVar49 = uVar26;
    }
    if (0 < (int)uVar49) {
      pvVar33 = ImGui::MemAlloc((long)(int)uVar49 << 4);
      if ((void *)local_438._8_8_ != (void *)0x0) {
        memcpy(pvVar33,(void *)local_438._8_8_,(long)(int)local_438._0_4_ << 4);
        ImGui::MemFree((void *)local_438._8_8_);
      }
      auVar14._4_8_ = pvVar33;
      auVar14._0_4_ = uVar49;
      auVar14._12_4_ = 0;
      local_438 = auVar14 << 0x20;
    }
  }
  local_438._0_4_ = uVar26;
  if (local_3e8._4_4_ < (int)uVar26) {
    if (local_3e8._4_4_ == 0) {
      uVar49 = 8;
    }
    else {
      uVar49 = local_3e8._4_4_ / 2 + local_3e8._4_4_;
    }
    if ((int)uVar49 <= (int)uVar26) {
      uVar49 = uVar26;
    }
    if (local_3e8._4_4_ < (int)uVar49) {
      pvVar33 = ImGui::MemAlloc((long)(int)uVar49 * 0x1c);
      if (pvStack_3e0 != (void *)0x0) {
        memcpy(pvVar33,pvStack_3e0,(long)(int)(stbtt_uint32)local_3e8 * 0x1c);
        ImGui::MemFree(pvStack_3e0);
      }
      local_3e8 = (ulong)uVar49 << 0x20;
      pvStack_3e0 = pvVar33;
    }
  }
  local_3e8 = CONCAT44(local_3e8._4_4_,uVar26);
  iVar61 = 0;
  atlas_00 = atlas;
  memset((void *)local_438._8_8_,0,(long)(int)local_438._0_4_ << 4);
  memset(pvStack_3e0,0,(long)(int)(stbtt_uint32)local_3e8 * 0x1c);
  fVar67 = 0.0;
  if (0 < (int)uVar6) {
    lVar56 = 0;
    iVar27 = 0;
    iVar57 = 0;
    do {
      iVar39 = *(int *)((long)local_490 + lVar56 * 0x110 + 0xe8);
      if (iVar39 != 0) {
        if ((int)local_438._0_4_ <= iVar27) {
          __function = "T &ImVector<stbrp_rect>::operator[](int) [T = stbrp_rect]";
          goto LAB_001334e3;
        }
        psVar63 = (stbtt_fontinfo *)(lVar56 * 0x110 + (long)local_490);
        *(long *)&psVar63[1].hmtx = (long)iVar27 * 0x10 + local_438._8_8_;
        if ((int)(stbtt_uint32)local_3e8 <= iVar57) {
          __function = "T &ImVector<stbtt_packedchar>::operator[](int) [T = stbtt_packedchar]";
          goto LAB_001334e3;
        }
        pvVar33 = (void *)((long)iVar57 * 0x1c + (long)pvStack_3e0);
        *(void **)&psVar63[1].gpos = pvVar33;
        if ((atlas->ConfigData).Size <= lVar56) goto LAB_0013354a;
        pIVar55 = (atlas->ConfigData).Data;
        fVar67 = pIVar55[lVar56].SizePixels;
        *(float *)&psVar63[1].userdata = fVar67;
        *(undefined4 *)((long)&psVar63[1].userdata + 4) = 0;
        psVar63[1].data = *(uchar **)&psVar63[1].gsubrs.cursor;
        psVar63[1].fontstart = *(int *)&psVar63[1].gsubrs.data;
        *(void **)&psVar63[1].loca = pvVar33;
        *(char *)&psVar63[1].glyf = (char)pIVar55[lVar56].OversampleH;
        *(char *)((long)&psVar63[1].glyf + 1) = (char)pIVar55[lVar56].OversampleV;
        if (fVar67 <= 0.0) {
          fVar67 = -fVar67;
          uVar26 = (uint)(ushort)(*(ushort *)(psVar63->data + (long)psVar63->head + 0x12) << 8 |
                                 *(ushort *)(psVar63->data + (long)psVar63->head + 0x12) >> 8);
        }
        else {
          puVar34 = psVar63->data;
          lVar32 = (long)psVar63->hhea;
          uVar26 = ((int)(short)((ushort)puVar34[lVar32 + 4] << 8) | (uint)puVar34[lVar32 + 5]) -
                   ((int)(short)((ushort)puVar34[lVar32 + 6] << 8) | (uint)puVar34[lVar32 + 7]);
        }
        fVar67 = fVar67 / (float)(int)uVar26;
        iVar27 = iVar27 + iVar39;
        iVar57 = iVar57 + iVar39;
        if (0 < *(int *)&psVar63[1].gsubrs.data) {
          local_428._0_8_ = lVar56;
          iVar39 = atlas->TexGlyphPadding;
          lVar64 = 6;
          lVar32 = 0;
          atlas = atlas_00;
          do {
            if (*(int *)&psVar63[1].gsubrs.data <= lVar32) goto LAB_001334ce;
            iVar28 = stbtt_FindGlyphIndex
                               (psVar63,*(int *)(*(long *)&psVar63[1].gsubrs.cursor + lVar32 * 4));
            if (iVar28 == 0) {
              __assert_fail("glyph_index_in_font != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui_draw.cpp"
                            ,0x820,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
            }
            stbtt_GetGlyphBitmapBoxSubpixel
                      (psVar63,iVar28,(float)pIVar55[lVar56].OversampleH * fVar67,
                       (float)pIVar55[lVar56].OversampleV * fVar67,fVar67,in_XMM3_Da,
                       (int *)local_258,(int *)local_440,(int *)&local_3c0,(int *)&local_44c);
            uVar26 = (pIVar55[lVar56].OversampleH +
                     (((stbtt_uint32)local_3c0 + iVar39) - (int)local_258[0].data)) - 1;
            lVar45 = *(long *)&psVar63[1].hmtx;
            *(short *)(lVar45 + -2 + lVar64) = (short)uVar26;
            uVar49 = (pIVar55[lVar56].OversampleV + ((local_44c + iVar39) - local_440._0_4_)) - 1;
            *(short *)(lVar45 + lVar64) = (short)uVar49;
            iVar61 = iVar61 + (uVar49 & 0xffff) * (uVar26 & 0xffff);
            lVar32 = lVar32 + 1;
            lVar64 = lVar64 + 0x10;
          } while (lVar32 < *(int *)&psVar63[1].gsubrs.data);
          lVar56 = local_428._0_8_;
          atlas_00 = atlas;
        }
      }
      lVar56 = lVar56 + 1;
    } while (lVar56 != lVar40);
    fVar67 = (float)iVar61;
  }
  if (fVar67 < 0.0) {
    fVar67 = sqrtf(fVar67);
  }
  else {
    fVar67 = SQRT(fVar67);
  }
  atlas->TexHeight = 0;
  iVar61 = atlas->TexDesiredWidth;
  if (iVar61 < 1) {
    iVar27 = (int)fVar67;
    iVar61 = 0x1000;
    if ((iVar27 < 0xb33) && (iVar61 = 0x800, iVar27 < 0x599)) {
      iVar61 = (uint)(0x2cb < iVar27) * 0x200 + 0x200;
    }
  }
  atlas->TexWidth = iVar61;
  local_450 = atlas->TexGlyphPadding;
  ptr_00 = (stbrp_context *)ImGui::MemAlloc(0x48);
  iVar27 = iVar61 - local_450;
  local_3d0 = (stbrp_node *)ImGui::MemAlloc((long)iVar27 << 4);
  if ((ptr_00 == (stbrp_context *)0x0) || (local_3d0 == (stbrp_node *)0x0)) {
    if (ptr_00 != (stbrp_context *)0x0) {
      ImGui::MemFree(ptr_00);
    }
    if (local_3d0 != (stbrp_node *)0x0) {
      ImGui::MemFree(local_3d0);
    }
    local_3d0 = (stbrp_node *)0x0;
    local_450 = 0;
    iVar61 = 0;
    ptr_00 = (stbrp_context *)0x0;
  }
  else {
    if ((local_450 < -0x7fff) || (0xffff < iVar27)) {
      __assert_fail("width <= 0xffff && height <= 0xffff",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imstb_rectpack.h"
                    ,0x10a,"void stbrp_init_target(stbrp_context *, int, int, stbrp_node *, int)");
    }
    if (iVar27 < 2) {
      uVar29 = 0;
    }
    else {
      uVar29 = 0;
      psVar12 = local_3d0;
      do {
        uVar29 = uVar29 + 1;
        psVar12->next = psVar12 + 1;
        psVar12 = psVar12 + 1;
      } while (iVar27 - 1 != uVar29);
      uVar29 = uVar29 & 0xffffffff;
    }
    local_3d0[uVar29].next = (stbrp_node *)0x0;
    ptr_00->init_mode = 1;
    ptr_00->heuristic = 0;
    ptr_00->free_head = local_3d0;
    ptr_00->active_head = ptr_00->extra;
    ptr_00->width = iVar27;
    ptr_00->height = 0x8000 - local_450;
    ptr_00->num_nodes = iVar27;
    ptr_00->align = (iVar27 * 2 + -1) / iVar27;
    ptr_00->extra[0].x = 0;
    ptr_00->extra[0].y = 0;
    ptr_00->extra[0].next = ptr_00->extra + 1;
    ptr_00->extra[1].x = (stbrp_coord)iVar27;
    ptr_00->extra[1].y = 0xffff;
    ptr_00->extra[1].next = (stbrp_node *)0x0;
  }
  local_2e8 = ptr_00;
  ImFontAtlasBuildPackCustomRects(atlas_00,ptr_00);
  if (0 < (int)uVar6) {
    lVar56 = 0;
    do {
      lVar32 = lVar56 * 0x110;
      iVar27 = *(int *)((long)local_490 + lVar32 + 0xe8);
      if (iVar27 != 0) {
        stbrp_pack_rects(local_2e8,*(stbrp_rect **)((long)local_490 + lVar32 + 200),iVar27);
        lVar64 = (long)*(int *)((long)local_490 + lVar32 + 0xe8);
        if (0 < lVar64) {
          lVar32 = *(long *)((long)local_490 + lVar32 + 200);
          lVar45 = 0;
          do {
            if (*(int *)(lVar32 + 0xc + lVar45) != 0) {
              iVar27 = (uint)*(ushort *)(lVar32 + 6 + lVar45) +
                       (uint)*(ushort *)(lVar32 + 10 + lVar45);
              if (iVar27 < atlas_00->TexHeight) {
                iVar27 = atlas_00->TexHeight;
              }
              atlas_00->TexHeight = iVar27;
            }
            lVar45 = lVar45 + 0x10;
          } while (lVar64 * 0x10 != lVar45);
        }
      }
      lVar56 = lVar56 + 1;
    } while (lVar56 != lVar40);
  }
  uVar26 = atlas_00->TexHeight;
  if ((atlas_00->Flags & 1) == 0) {
    uVar26 = (int)(uVar26 - 1) >> 1 | uVar26 - 1;
    uVar26 = (int)uVar26 >> 2 | uVar26;
    uVar26 = (int)uVar26 >> 4 | uVar26;
    uVar26 = (int)uVar26 >> 8 | uVar26;
    uVar26 = (int)uVar26 >> 0x10 | uVar26;
  }
  iVar57 = uVar26 + 1;
  atlas_00->TexHeight = iVar57;
  iVar27 = atlas_00->TexWidth;
  (atlas_00->TexUvScale).x = 1.0 / (float)iVar27;
  (atlas_00->TexUvScale).y = 1.0 / (float)iVar57;
  puVar34 = (uchar *)ImGui::MemAlloc((long)(iVar57 * iVar27));
  atlas_00->TexPixelsAlpha8 = puVar34;
  atlas_01 = atlas_00;
  memset(puVar34,0,(long)atlas_00->TexHeight * (long)atlas_00->TexWidth);
  if (0 < (int)uVar6) {
    local_358 = atlas_00->TexPixelsAlpha8;
    lVar32 = (long)iVar61;
    lVar56 = 0;
    local_310 = iVar61;
    do {
      local_370 = lVar56;
      if ((atlas_00->ConfigData).Size <= lVar56) goto LAB_0013354a;
      if (*(int *)((long)local_490 + lVar56 * 0x110 + 0xe8) != 0) {
        psVar63 = (stbtt_fontinfo *)(lVar56 * 0x110 + (long)local_490);
        local_2d8 = *(float *)&psVar63[1].userdata;
        local_390 = psVar63;
        if (local_2d8 <= 0.0) {
          uStack_2d4 = 0x80000000;
          uStack_2d0 = 0x80000000;
          uStack_2cc = 0x80000000;
          local_2d8 = -local_2d8;
          uVar26 = (uint)(ushort)(*(ushort *)(psVar63->data + (long)psVar63->head + 0x12) << 8 |
                                 *(ushort *)(psVar63->data + (long)psVar63->head + 0x12) >> 8);
        }
        else {
          puVar34 = psVar63->data;
          lVar56 = (long)psVar63->hhea;
          uVar26 = ((int)(short)((ushort)puVar34[lVar56 + 4] << 8) | (uint)puVar34[lVar56 + 5]) -
                   ((int)(short)((ushort)puVar34[lVar56 + 6] << 8) | (uint)puVar34[lVar56 + 7]);
          uStack_2d4 = 0;
          uStack_2d0 = 0;
          uStack_2cc = 0;
        }
        local_2d8 = local_2d8 / (float)(int)uVar26;
        bVar60 = (byte)psVar63[1].glyf;
        fVar67 = (float)bVar60;
        local_37c = 0.0;
        local_380 = 0.0;
        local_410 = (ulong)bVar60;
        uVar29 = local_410;
        local_410._0_4_ = (uint)bVar60;
        if (bVar60 != 0) {
          local_380 = (float)(int)(1 - (uint)local_410) / (fVar67 + fVar67);
        }
        bVar3 = *(byte *)((long)&psVar63[1].glyf + 1);
        fVar74 = (float)bVar3;
        if (bVar3 != 0) {
          local_37c = (float)(int)(1 - (uint)bVar3) / (fVar74 + fVar74);
        }
        local_2b8 = (atlas_00->ConfigData).Data;
        local_410 = uVar29;
        if (0 < psVar63[1].fontstart) {
          lVar56._0_4_ = psVar63[1].hmtx;
          lVar56._4_4_ = psVar63[1].kern;
          fVar71 = 1.0 / fVar67;
          local_31c = fVar71;
          local_320 = 1.0 / fVar74;
          local_3b4 = fVar67 * local_2d8;
          fVar74 = fVar74 * local_2d8;
          fVar67 = fVar74;
          if (local_3b4 <= fVar74) {
            fVar67 = local_3b4;
          }
          local_374 = (0.35 / fVar67) * (0.35 / fVar67);
          local_268 = ZEXT416((uint)fVar74);
          fVar74 = -fVar74;
          local_48 = fVar74;
          uStack_44 = 0x80000000;
          uStack_40 = 0x80000000;
          uStack_3c = 0x80000000;
          local_290 = (ulong)bVar60;
          local_298 = (ulong)(uint)bVar3;
          local_408 = (ulong)bVar3;
          lVar64 = 0;
          local_2b0 = lVar56;
          do {
            if (((*(int *)(lVar56 + 0xc + lVar64 * 0x10) != 0) &&
                (lVar45 = lVar64 * 0x10 + lVar56, *(short *)(lVar45 + 4) != 0)) &&
               (*(short *)(lVar45 + 6) != 0)) {
              if (psVar63[1].data == (uchar *)0x0) {
                iVar61 = *(int *)((long)&psVar63[1].userdata + 4) + (int)lVar64;
              }
              else {
                iVar61 = *(int *)(psVar63[1].data + lVar64 * 4);
              }
              local_2a8 = (short *)(lVar64 * 0x1c + *(long *)&psVar63[1].loca);
              local_368 = lVar45;
              local_2a0 = lVar64;
              iVar27 = stbtt_FindGlyphIndex(psVar63,iVar61);
              lVar45 = local_368;
              sVar38 = (short)local_450;
              *(short *)(local_368 + 8) = *(short *)(local_368 + 8) + sVar38;
              *(short *)(local_368 + 10) = *(short *)(local_368 + 10) + sVar38;
              *(short *)(local_368 + 4) = *(short *)(local_368 + 4) - sVar38;
              *(short *)(local_368 + 6) = *(short *)(local_368 + 6) - sVar38;
              puVar34 = psVar63->data;
              uVar17 = *(ushort *)(puVar34 + (long)psVar63->hhea + 0x22) << 8 |
                       *(ushort *)(puVar34 + (long)psVar63->hhea + 0x22) >> 8;
              iVar61 = psVar63->hmtx;
              lVar56 = (ulong)uVar17 * 4 + (long)iVar61 + -4;
              lVar64 = (ulong)uVar17 * 4 + (long)iVar61 + -3;
              if (iVar27 < (int)(uint)uVar17) {
                lVar56 = (long)(iVar27 * 4) + (long)iVar61;
                lVar64 = (long)(iVar27 * 4) + 1 + (long)iVar61;
              }
              local_314 = (uint)puVar34[lVar56];
              local_318 = (uint)puVar34[lVar64];
              stbtt_GetGlyphBitmapBoxSubpixel
                        (psVar63,iVar27,local_3b4,(float)local_268._0_4_,fVar71,fVar74,&local_300,
                         &local_304,&local_26c,&local_270);
              uVar58 = (uint)*(ushort *)(lVar45 + 8);
              uVar69 = 0;
              local_348 = (uchar *)(ulong)*(ushort *)(lVar45 + 10);
              local_3c8 = (ulong)*(ushort *)(lVar45 + 4);
              local_360 = (ulong)*(ushort *)(lVar45 + 6);
              uVar26 = stbtt_GetGlyphShape(psVar63,iVar27,(stbtt_vertex **)&local_3c0);
              uVar29 = local_408;
              uVar49 = ((int)local_3c8 - (int)local_410) + 1;
              stbtt_GetGlyphBitmapBoxSubpixel
                        (local_390,iVar27,local_3b4,(float)local_268._0_4_,fVar71,fVar74,
                         (int *)&local_44c,&local_2fc,(int *)0x0,(int *)0x0);
              sVar25 = local_44c;
              local_3ac = uVar49;
              if (uVar49 != 0) {
                iVar61 = ((int)local_360 - (int)uVar29) + 1;
                local_3a8 = CONCAT44(local_3a8._4_4_,iVar61);
                if (iVar61 != 0) {
                  lVar56 = CONCAT44(local_3c0._4_4_,(stbtt_uint32)local_3c0);
                  local_258[0].data = (uchar *)((ulong)local_258[0].data & 0xffffffff00000000);
                  if ((int)uVar26 < 1) {
                    uVar49 = 0;
                  }
                  else {
                    lVar64 = 0;
                    uVar49 = 0;
                    do {
                      uVar49 = uVar49 + (*(char *)(lVar56 + 0xc + lVar64) == '\x01');
                      lVar64 = lVar64 + 0xe;
                    } while ((ulong)uVar26 * 0xe != lVar64);
                  }
                  local_378 = local_2fc;
                  if (uVar49 == 0) {
LAB_00131b95:
                    local_448 = (void *)0x0;
LAB_00131b9e:
                    points = (stbtt__point *)0x0;
                  }
                  else {
                    local_448 = ImGui::MemAlloc((long)(int)uVar49 << 2);
                    if (local_448 == (void *)0x0) {
                      uVar49 = 0;
                      goto LAB_00131b9e;
                    }
                    uVar52 = 0;
                    iVar61 = 0;
                    points = (stbtt__point *)0x0;
                    do {
                      local_428._0_8_ = uVar52;
                      if ((int)uVar52 == 0) {
LAB_00131957:
                        local_258[0].data = (uchar *)((ulong)local_258[0].data & 0xffffffff00000000)
                        ;
                        if ((int)uVar26 < 1) {
                          lVar64 = -1;
                        }
                        else {
                          uVar62 = 0xffffffff;
                          fVar74 = 0.0;
                          lVar64 = 0;
                          fVar67 = 0.0;
                          do {
                            puVar34 = local_258[0].data;
                            switch(*(undefined1 *)(lVar56 + 0xc + lVar64)) {
                            case 1:
                              if (-1 < (int)uVar62) {
                                *(int *)((long)local_448 + (ulong)uVar62 * 4) =
                                     (int)local_258[0].data - iVar61;
                              }
                              uVar62 = uVar62 + 1;
                              sVar38 = *(short *)(lVar56 + lVar64);
                              sVar18 = *(short *)(lVar56 + 2 + lVar64);
                              iVar61 = (int)local_258[0].data;
                              break;
                            case 2:
                              sVar38 = *(short *)(lVar56 + lVar64);
                              sVar18 = *(short *)(lVar56 + 2 + lVar64);
                              break;
                            case 3:
                              stbtt__tesselate_curve
                                        (points,(int *)local_258,fVar67,fVar74,
                                         (float)(int)*(short *)(lVar56 + 4 + lVar64),
                                         (float)(int)*(short *)(lVar56 + 6 + lVar64),
                                         (float)(int)*(short *)(lVar56 + lVar64),
                                         (float)(int)*(short *)(lVar56 + 2 + lVar64),local_374,0);
                              goto LAB_00131abc;
                            case 4:
                              stbtt__tesselate_cubic
                                        (points,(int *)local_258,fVar67,fVar74,
                                         (float)(int)*(short *)(lVar56 + 4 + lVar64),
                                         (float)(int)*(short *)(lVar56 + 6 + lVar64),
                                         (float)(int)*(short *)(lVar56 + 8 + lVar64),
                                         (float)(int)*(short *)(lVar56 + 10 + lVar64),
                                         (float)(int)*(short *)(lVar56 + lVar64),
                                         (float)(int)*(short *)(lVar56 + 2 + lVar64),local_374,0);
LAB_00131abc:
                              fVar67 = (float)(int)*(short *)(lVar56 + lVar64);
                              fVar74 = (float)(int)*(short *)(lVar56 + 2 + lVar64);
                              puVar34 = local_258[0].data;
                            default:
                              goto switchD_0013199b_default;
                            }
                            puVar34 = (uchar *)CONCAT44(local_258[0].data._4_4_,
                                                        (int)local_258[0].data + 1);
                            fVar74 = (float)(int)sVar18;
                            fVar67 = (float)(int)sVar38;
                            if (points != (stbtt__point *)0x0) {
                              points[(int)local_258[0].data].x = fVar67;
                              points[(int)local_258[0].data].y = fVar74;
                            }
switchD_0013199b_default:
                            local_258[0].data = puVar34;
                            lVar64 = lVar64 + 0xe;
                          } while ((ulong)uVar26 * 0xe != lVar64);
                          lVar64 = (long)(int)uVar62;
                          uVar29 = local_408;
                        }
                        *(int *)((long)local_448 + lVar64 * 4) = (int)local_258[0].data - iVar61;
                        bVar16 = true;
                      }
                      else {
                        points = (stbtt__point *)ImGui::MemAlloc((long)(int)local_258[0].data << 3);
                        if (points != (stbtt__point *)0x0) goto LAB_00131957;
                        points = (stbtt__point *)0x0;
                        bVar16 = false;
                      }
                      if (!bVar16) {
                        ImGui::MemFree(points);
                        ImGui::MemFree(local_448);
                        uVar49 = 0;
                        goto LAB_00131b95;
                      }
                      uVar52 = (ulong)(local_428._0_4_ + 1);
                    } while (local_428._0_4_ == 0);
                  }
                  local_350 = points;
                  if (points != (stbtt__point *)0x0) {
                    if ((int)uVar49 < 1) {
                      size = 0x14;
                    }
                    else {
                      uVar52 = 0;
                      lVar56 = 0;
                      do {
                        lVar56 = (long)(int)lVar56 + (long)*(int *)((long)local_448 + uVar52 * 4);
                        uVar52 = uVar52 + 1;
                      } while (uVar49 != uVar52);
                      size = lVar56 * 0x14 + 0x14;
                    }
                    p_00 = (stbtt__edge *)ImGui::MemAlloc(size);
                    if (p_00 != (stbtt__edge *)0x0) {
                      if ((int)uVar49 < 1) {
                        uVar26 = 0;
                      }
                      else {
                        uVar52 = 0;
                        uVar26 = 0;
                        iVar61 = 0;
                        do {
                          iVar27 = *(int *)((long)local_448 + uVar52 * 4);
                          if (0 < iVar27) {
                            uVar46 = (ulong)(iVar27 - 1);
                            uVar53 = 0;
                            do {
                              iVar57 = (int)uVar46;
                              fVar67 = local_350[(long)iVar61 + (long)iVar57].y;
                              fVar74 = local_350[(long)iVar61 + uVar53].y;
                              if ((fVar67 != fVar74) || (NAN(fVar67) || NAN(fVar74))) {
                                iVar28 = (int)uVar53;
                                iVar39 = iVar57;
                                if (fVar67 <= fVar74) {
                                  iVar39 = iVar28;
                                  iVar28 = iVar57;
                                }
                                p_00[(int)uVar26].invert = (uint)(fVar74 < fVar67);
                                p_00[(int)uVar26].x0 =
                                     local_350[(long)iVar61 + (long)iVar39].x * local_3b4 + 0.0;
                                p_00[(int)uVar26].y0 =
                                     local_350[(long)iVar61 + (long)iVar39].y * local_48 + 0.0;
                                p_00[(int)uVar26].x1 =
                                     local_350[(long)iVar61 + (long)iVar28].x * local_3b4 + 0.0;
                                p_00[(int)uVar26].y1 =
                                     local_350[(long)iVar61 + (long)iVar28].y * local_48 + 0.0;
                                uVar26 = uVar26 + 1;
                              }
                              uVar46 = uVar53 & 0xffffffff;
                              uVar53 = uVar53 + 1;
                              uVar29 = local_408;
                            } while ((long)uVar53 < (long)*(int *)((long)local_448 + uVar52 * 4));
                          }
                          iVar61 = iVar61 + iVar27;
                          uVar52 = uVar52 + 1;
                        } while (uVar52 != uVar49);
                      }
                      stbtt__sort_edges_quicksort(p_00,uVar26);
                      if (1 < (int)uVar26) {
                        uVar52 = 1;
                        do {
                          fVar67 = p_00[uVar52].x0;
                          fVar74 = p_00[uVar52].y0;
                          iVar61 = p_00[uVar52].invert;
                          local_258[0].cursor = iVar61;
                          local_258[0].data = *(uchar **)&p_00[uVar52].x1;
                          uVar53 = uVar52 & 0xffffffff;
                          do {
                            uVar49 = (uint)uVar53;
                            if ((int)uVar49 < 1) break;
                            fVar71 = p_00[uVar53 - 1].y0;
                            if (fVar74 < fVar71) {
                              psVar59 = p_00 + uVar53;
                              psVar59->invert = psVar59[-1].invert;
                              fVar68 = psVar59[-1].y0;
                              fVar73 = psVar59[-1].x1;
                              fVar70 = psVar59[-1].y1;
                              psVar59->x0 = psVar59[-1].x0;
                              psVar59->y0 = fVar68;
                              psVar59->x1 = fVar73;
                              psVar59->y1 = fVar70;
                              uVar53 = (ulong)(uVar49 - 1);
                            }
                            uVar49 = (uint)uVar53;
                          } while (fVar74 < fVar71);
                          if (uVar52 != uVar49) {
                            p_00[(int)uVar49].x0 = fVar67;
                            p_00[(int)uVar49].y0 = fVar74;
                            *(uchar **)&p_00[(int)uVar49].x1 = local_258[0].data;
                            p_00[(int)uVar49].invert = iVar61;
                          }
                          uVar52 = uVar52 + 1;
                        } while (uVar52 != uVar26);
                      }
                      uVar49 = (int)local_3c8 - (int)local_410;
                      local_3c8 = (ulong)uVar49;
                      local_440 = (undefined1  [8])0x0;
                      scanline = local_258;
                      if (0x3f < (int)uVar49) {
                        scanline = (stbtt__buf *)ImGui::MemAlloc((ulong)local_3ac * 8 + 4);
                      }
                      uVar49 = (int)local_360 - (int)uVar29;
                      local_360 = (ulong)uVar49;
                      p_00[(int)uVar26].y0 = (float)((int)(float)local_3a8 + local_378) + 1.0;
                      if (uVar49 < 0x7fffffff) {
                        local_348 = local_358 + (long)local_348 * lVar32 + CONCAT44(uVar69,uVar58);
                        local_308 = (float)(int)sVar25;
                        local_288 = (long)(int)local_3ac;
                        local_330 = (float *)((long)&scanline->data + local_288 * 4);
                        local_2e0 = local_330 + 1;
                        local_278 = local_288 * 4;
                        local_3b0 = (float)(int)local_3ac;
                        local_280 = (long)(int)(uint)local_3c8 * 4 + 8;
                        local_340 = 0;
                        local_338 = 0;
                        local_388 = (undefined8 *)0x0;
                        local_3fc = 0;
                        local_3f0 = (stbtt__active_edge *)0x0;
                        psVar59 = p_00;
                        iVar61 = local_378;
                        do {
                          fVar67 = (float)iVar61;
                          fVar74 = fVar67 + 1.0;
                          local_30c = iVar61;
                          memset(scanline,0,local_278);
                          memset(local_330,0,local_280);
                          psVar65 = local_3f0;
                          if (local_440 != (undefined1  [8])0x0) {
                            auVar36 = local_440;
                            psVar43 = (stbtt__active_edge *)local_440;
                            do {
                              psVar44 = (stbtt__active_edge *)auVar36;
                              if (((stbtt__active_edge *)auVar36)->ey <= fVar67) {
                                psVar43->next = ((stbtt__active_edge *)auVar36)->next;
                                if ((((stbtt__active_edge *)auVar36)->direction == 0.0) &&
                                   (!NAN(((stbtt__active_edge *)auVar36)->direction))) {
                                  __assert_fail("z->direction",
                                                "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imstb_truetype.h"
                                                ,0xc63,
                                                "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                                               );
                                }
                                ((stbtt__active_edge *)auVar36)->direction = 0.0;
                                ((stbtt__active_edge *)auVar36)->next = psVar65;
                                psVar44 = psVar43;
                                psVar65 = (stbtt__active_edge *)auVar36;
                              }
                              auVar36 = (undefined1  [8])psVar44->next;
                              psVar43 = psVar44;
                            } while (auVar36 != (undefined1  [8])0x0);
                          }
                          fVar71 = psVar59->y0;
                          if (fVar71 <= fVar74) {
                            bVar16 = local_378 != 0;
                            bVar66 = (int)local_338 == 0;
                            do {
                              if ((fVar71 != psVar59->y1) || (NAN(fVar71) || NAN(psVar59->y1))) {
                                if (psVar65 == (stbtt__active_edge *)0x0) {
                                  if (local_3fc == 0) {
                                    puVar37 = (undefined8 *)ImGui::MemAlloc(0x6408);
                                    if (puVar37 == (undefined8 *)0x0) {
                                      local_3f0 = psVar65;
                                      psVar65 = (stbtt__active_edge *)0x0;
                                      goto LAB_0013273f;
                                    }
                                    *puVar37 = local_388;
                                    local_3fc = 800;
                                    local_388 = puVar37;
                                  }
                                  lVar56 = (long)local_3fc;
                                  local_3fc = local_3fc + -1;
                                  local_3f0 = psVar65;
                                  psVar65 = (stbtt__active_edge *)(local_388 + lVar56 * 4 + -3);
                                }
                                else {
                                  local_3f0 = psVar65->next;
                                }
LAB_0013273f:
                                if (psVar65 == (stbtt__active_edge *)0x0) {
                                  __assert_fail("z != __null",
                                                "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imstb_truetype.h"
                                                ,0xad1,
                                                "stbtt__active_edge *stbtt__new_active(stbtt__hheap *, stbtt__edge *, int, float, void *)"
                                               );
                                }
                                fVar71 = psVar59->x0;
                                fVar68 = psVar59->y0;
                                fVar73 = psVar59->y1;
                                fVar70 = (psVar59->x1 - fVar71) / (fVar73 - fVar68);
                                psVar65->fdx = fVar70;
                                psVar65->fdy = (float)(-(uint)(fVar70 != 0.0) & (uint)(1.0 / fVar70)
                                                      );
                                psVar65->fx = ((fVar67 - fVar68) * fVar70 + fVar71) - local_308;
                                psVar65->direction =
                                     *(float *)(&DAT_001b3cf4 + (ulong)(psVar59->invert == 0) * 4);
                                psVar65->sy = fVar68;
                                psVar65->ey = fVar73;
                                psVar65->next = (stbtt__active_edge *)0x0;
                                if (fVar73 < fVar67 && (bVar66 && bVar16)) {
                                  psVar65->ey = fVar67;
                                }
                                if (psVar65->ey < fVar67) {
                                  __assert_fail("z->ey >= scan_y_top",
                                                "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imstb_truetype.h"
                                                ,0xc76,
                                                "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                                               );
                                }
                                psVar65->next = (stbtt__active_edge *)local_440;
                                local_440 = (undefined1  [8])psVar65;
                              }
                              else {
                                local_3f0 = psVar65;
                              }
                              fVar71 = psVar59[1].y0;
                              psVar59 = psVar59 + 1;
                              psVar65 = local_3f0;
                              auVar36 = local_440;
                            } while (fVar71 <= fVar74);
                          }
                          else {
                            local_3f0 = psVar65;
                            auVar36 = local_440;
                          }
                          for (; auVar36 != (undefined1  [8])0x0;
                              auVar36 = (undefined1  [8])((stbtt__active_edge *)auVar36)->next) {
                            fVar71 = ((stbtt__active_edge *)auVar36)->ey;
                            if (fVar71 < fVar67) {
                              __assert_fail("e->ey >= y_top",
                                            "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imstb_truetype.h"
                                            ,0xba5,
                                            "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                           );
                            }
                            fVar68 = ((stbtt__active_edge *)auVar36)->fx;
                            fVar73 = ((stbtt__active_edge *)auVar36)->fdx;
                            if ((fVar73 != 0.0) || (NAN(fVar73))) {
                              fVar70 = ((stbtt__active_edge *)auVar36)->sy;
                              if (fVar74 < fVar70) {
                                __assert_fail("e->sy <= y_bottom && e->ey >= y_top",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imstb_truetype.h"
                                              ,3000,
                                              "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                             );
                              }
                              fVar77 = fVar73 + fVar68;
                              fVar72 = (float)(~-(uint)(fVar67 < fVar70) & (uint)fVar68 |
                                              (uint)((fVar70 - fVar67) * fVar73 + fVar68) &
                                              -(uint)(fVar67 < fVar70));
                              if ((((fVar72 < 0.0) ||
                                   (fVar76 = (float)(~-(uint)(fVar71 < fVar74) & (uint)fVar77 |
                                                    (uint)((fVar71 - fVar67) * fVar73 + fVar68) &
                                                    -(uint)(fVar71 < fVar74)), fVar76 < 0.0)) ||
                                  (local_3b0 <= fVar72)) || (local_3b0 <= fVar76)) {
                                if ((uint)local_3c8 < 0x7fffffff) {
                                  local_2f8 = ZEXT416((uint)fVar68);
                                  local_3a8 = (ulong)(uint)fVar77;
                                  uStack_3a0 = 0;
                                  uStack_39c = 0;
                                  local_328 = CONCAT44(local_328._4_4_,fVar73);
                                  uVar26 = 0;
                                  do {
                                    fVar71 = (float)(int)uVar26;
                                    uVar49 = uVar26 + 1;
                                    fVar72 = (float)(int)uVar49;
                                    fVar70 = (fVar71 - fVar68) / fVar73 + fVar67;
                                    fVar73 = (fVar72 - fVar68) / fVar73 + fVar67;
                                    local_428._0_4_ = fVar71;
                                    if ((fVar71 <= fVar68) || (fVar77 <= fVar72)) {
                                      if ((fVar77 < fVar71) && (fVar72 < fVar68)) {
                                        stbtt__handle_clipped_edge
                                                  ((float *)scanline,uVar26,
                                                   (stbtt__active_edge *)auVar36,fVar68,fVar67,
                                                   fVar72,fVar73);
                                        fVar68 = fVar72;
                                        fVar76 = fVar73;
                                        fVar71 = (float)local_428._0_4_;
LAB_00132305:
                                        stbtt__handle_clipped_edge
                                                  ((float *)scanline,uVar26,
                                                   (stbtt__active_edge *)auVar36,fVar68,fVar76,
                                                   fVar71,fVar70);
                                        fVar68 = (float)local_428._0_4_;
                                        goto LAB_00132321;
                                      }
                                      fVar76 = fVar67;
                                      if (((fVar68 < fVar71) && (fVar71 < fVar77)) ||
                                         ((fVar77 < fVar71 && (fVar71 < fVar68))))
                                      goto LAB_00132305;
                                      fVar71 = fVar67;
                                      fVar70 = fVar73;
                                      if (((fVar68 < fVar72) && (fVar72 < fVar77)) ||
                                         ((fVar77 < fVar72 && (fVar72 < fVar68))))
                                      goto LAB_00132274;
                                    }
                                    else {
                                      stbtt__handle_clipped_edge
                                                ((float *)scanline,uVar26,
                                                 (stbtt__active_edge *)auVar36,fVar68,fVar67,fVar71,
                                                 fVar70);
                                      fVar68 = (float)local_428._0_4_;
                                      fVar71 = fVar70;
                                      fVar70 = fVar73;
LAB_00132274:
                                      stbtt__handle_clipped_edge
                                                ((float *)scanline,uVar26,
                                                 (stbtt__active_edge *)auVar36,fVar68,fVar71,fVar72,
                                                 fVar70);
                                      fVar68 = fVar72;
LAB_00132321:
                                      fVar71 = fVar70;
                                      fVar77 = (float)local_3a8;
                                    }
                                    stbtt__handle_clipped_edge
                                              ((float *)scanline,uVar26,
                                               (stbtt__active_edge *)auVar36,fVar68,fVar71,fVar77,
                                               fVar74);
                                    fVar73 = (float)local_328;
                                    fVar68 = (float)local_2f8._0_4_;
                                    fVar77 = (float)local_3a8;
                                    uVar26 = uVar49;
                                  } while (local_3ac != uVar49);
                                }
                              }
                              else {
                                if (fVar70 <= fVar67) {
                                  fVar70 = fVar67;
                                }
                                uVar26 = (uint)fVar72;
                                if (fVar74 <= fVar71) {
                                  fVar71 = fVar74;
                                }
                                if (uVar26 == (int)fVar76) {
                                  if (((int)uVar26 < 0) || ((int)(uint)local_3c8 < (int)uVar26)) {
                                    __assert_fail("x >= 0 && x < len",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imstb_truetype.h"
                                                  ,0xbd4,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                 );
                                  }
                                  uVar29 = (ulong)uVar26;
                                  *(float *)((long)&scanline->data + uVar29 * 4) =
                                       (((fVar76 - (float)(int)uVar26) +
                                        (fVar72 - (float)(int)uVar26)) * -0.5 + 1.0) *
                                       ((stbtt__active_edge *)auVar36)->direction *
                                       (fVar71 - fVar70) +
                                       *(float *)((long)&scanline->data + uVar29 * 4);
                                  fVar68 = (fVar71 - fVar70) *
                                           ((stbtt__active_edge *)auVar36)->direction;
                                }
                                else {
                                  fVar73 = ((stbtt__active_edge *)auVar36)->fdy;
                                  fVar75 = fVar76;
                                  if (fVar76 < fVar72) {
                                    fVar68 = fVar67 - fVar70;
                                    fVar70 = (fVar67 - fVar71) + fVar74;
                                    fVar73 = -fVar73;
                                    fVar71 = fVar68 + fVar74;
                                    fVar75 = fVar72;
                                    fVar68 = fVar77;
                                    fVar72 = fVar76;
                                  }
                                  iVar27 = (int)fVar75;
                                  iVar61 = (int)fVar72 + 1;
                                  fVar76 = ((float)iVar61 - fVar68) * fVar73 + fVar67;
                                  fVar68 = ((stbtt__active_edge *)auVar36)->direction;
                                  fVar77 = (fVar76 - fVar70) * fVar68;
                                  lVar56 = (long)(int)fVar72;
                                  *(float *)((long)&scanline->data + lVar56 * 4) =
                                       (((fVar72 - (float)(int)fVar72) + 1.0) * -0.5 + 1.0) * fVar77
                                       + *(float *)((long)&scanline->data + lVar56 * 4);
                                  if (iVar27 - iVar61 != 0 && iVar61 <= iVar27) {
                                    do {
                                      *(float *)((long)&scanline->data + lVar56 * 4 + 4) =
                                           fVar73 * fVar68 * 0.5 + fVar77 +
                                           *(float *)((long)&scanline->data + lVar56 * 4 + 4);
                                      fVar77 = fVar77 + fVar73 * fVar68;
                                      lVar56 = lVar56 + 1;
                                    } while (iVar27 + -1 != (int)lVar56);
                                  }
                                  if (1.01 < ABS(fVar77)) {
                                    __assert_fail("fabsf(area) <= 1.01f",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imstb_truetype.h"
                                                  ,0xbfb,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                 );
                                  }
                                  uVar29 = (ulong)iVar27;
                                  *(float *)((long)&scanline->data + uVar29 * 4) =
                                       (fVar71 - (fVar73 * (float)(iVar27 - iVar61) + fVar76)) *
                                       (((fVar75 - (float)iVar27) + 0.0) * -0.5 + 1.0) * fVar68 +
                                       fVar77 + *(float *)((long)&scanline->data + uVar29 * 4);
                                  fVar68 = (fVar71 - fVar70) * fVar68;
                                }
                                local_2e0[uVar29] = fVar68 + local_2e0[uVar29];
                              }
                            }
                            else if (fVar68 < local_3b0) {
                              if (0.0 <= fVar68) {
                                local_2f8 = ZEXT416((uint)fVar68);
                                stbtt__handle_clipped_edge
                                          ((float *)scanline,(int)fVar68,
                                           (stbtt__active_edge *)auVar36,fVar68,fVar67,fVar68,fVar74
                                          );
                                iVar61 = (int)fVar68 + 1;
                                fVar68 = (float)local_2f8._0_4_;
                              }
                              else {
                                iVar61 = 0;
                              }
                              stbtt__handle_clipped_edge
                                        (local_330,iVar61,(stbtt__active_edge *)auVar36,fVar68,
                                         fVar67,fVar68,fVar74);
                            }
                          }
                          auVar36 = local_440;
                          if ((uint)local_3c8 < 0x7fffffff) {
                            fVar67 = 0.0;
                            psVar35 = scanline;
                            uVar29 = local_340;
                            lVar56 = local_288;
                            do {
                              fVar67 = fVar67 + *(float *)((long)&psVar35->data + local_288 * 4);
                              iVar61 = (int)(ABS(*(float *)&psVar35->data + fVar67) * 255.0 + 0.5);
                              uVar51 = (uchar)iVar61;
                              if (0xfe < iVar61) {
                                uVar51 = 0xff;
                              }
                              local_348[(int)uVar29] = uVar51;
                              uVar29 = (ulong)((int)uVar29 + 1);
                              psVar35 = (stbtt__buf *)((long)&psVar35->data + 4);
                              lVar56 = lVar56 + -1;
                            } while (lVar56 != 0);
                          }
                          for (; auVar36 != (undefined1  [8])0x0;
                              auVar36 = (undefined1  [8])((stbtt__active_edge *)auVar36)->next) {
                            ((stbtt__active_edge *)auVar36)->fx =
                                 ((stbtt__active_edge *)auVar36)->fdx +
                                 ((stbtt__active_edge *)auVar36)->fx;
                          }
                          iVar61 = local_30c + 1;
                          iVar27 = (int)local_338;
                          local_338 = (ulong)(iVar27 + 1);
                          local_340 = (ulong)(uint)((int)local_340 + local_310);
                          puVar37 = local_388;
                          uVar29 = local_408;
                        } while (iVar27 != (int)local_360);
                      }
                      else {
                        local_388 = (undefined8 *)0x0;
                        puVar37 = local_388;
                      }
                      while (puVar37 != (undefined8 *)0x0) {
                        puVar9 = (undefined8 *)*puVar37;
                        ImGui::MemFree(puVar37);
                        puVar37 = puVar9;
                      }
                      if (scanline != local_258) {
                        ImGui::MemFree(scanline);
                      }
                      ImGui::MemFree(p_00);
                    }
                    ImGui::MemFree(local_448);
                    ImGui::MemFree(local_350);
                  }
                }
              }
              bVar60 = (byte)uVar29;
              ImGui::MemFree((void *)CONCAT44(local_3c0._4_4_,(stbtt_uint32)local_3c0));
              atlas_00 = atlas_01;
              if (1 < (byte)local_410) {
                uVar17 = *(ushort *)(local_368 + 4);
                uVar5 = *(ushort *)(local_368 + 6);
                local_258[0].data = (uchar *)0x0;
                if (uVar5 != 0) {
                  puVar34 = local_358 +
                            (ulong)*(ushort *)(local_368 + 10) * lVar32 +
                            (ulong)*(ushort *)(local_368 + 8);
                  iVar61 = uVar17 - (uint)local_410;
                  uVar29 = (ulong)(iVar61 + 1);
                  uVar26 = 0;
                  do {
                    uVar52 = local_410;
                    memset(local_258,0,local_410);
                    switch((int)uVar52) {
                    case 2:
                      if (iVar61 < 0) {
LAB_00132ac5:
                        uVar53 = 0;
                        uVar52 = 0;
                      }
                      else {
                        uVar53 = 0;
                        uVar52 = 0;
                        do {
                          bVar60 = puVar34[uVar53];
                          bVar3 = *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar53 & 7));
                          *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar53 + 2 & 7)) =
                               bVar60;
                          uVar49 = (int)uVar52 + ((uint)bVar60 - (uint)bVar3);
                          uVar52 = (ulong)uVar49;
                          puVar34[uVar53] = (uchar)(uVar49 >> 1);
                          uVar53 = uVar53 + 1;
                        } while (uVar29 != uVar53);
                      }
                      break;
                    case 3:
                      if (iVar61 < 0) goto LAB_00132ac5;
                      uVar53 = 0;
                      uVar52 = 0;
                      do {
                        bVar60 = puVar34[uVar53];
                        bVar3 = *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar53 & 7));
                        *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar53 + 3 & 7)) = bVar60
                        ;
                        uVar52 = (ulong)((int)uVar52 + ((uint)bVar60 - (uint)bVar3));
                        puVar34[uVar53] = (uchar)(uVar52 / 3);
                        uVar53 = uVar53 + 1;
                      } while (uVar29 != uVar53);
                      break;
                    case 4:
                      if (iVar61 < 0) goto LAB_00132ac5;
                      uVar53 = 0;
                      uVar52 = 0;
                      do {
                        bVar60 = puVar34[uVar53];
                        uVar46 = (ulong)((uint)uVar53 & 7);
                        bVar3 = *(byte *)((long)&local_258[0].data + uVar46);
                        *(byte *)((long)&local_258[0].data + (uVar46 ^ 4)) = bVar60;
                        uVar49 = (int)uVar52 + ((uint)bVar60 - (uint)bVar3);
                        uVar52 = (ulong)uVar49;
                        puVar34[uVar53] = (uchar)(uVar49 >> 2);
                        uVar53 = uVar53 + 1;
                      } while (uVar29 != uVar53);
                      break;
                    case 5:
                      if (iVar61 < 0) goto LAB_00132ac5;
                      uVar53 = 0;
                      uVar52 = 0;
                      do {
                        bVar60 = puVar34[uVar53];
                        bVar3 = *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar53 & 7));
                        *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar53 + 5 & 7)) = bVar60
                        ;
                        uVar52 = (ulong)((int)uVar52 + ((uint)bVar60 - (uint)bVar3));
                        puVar34[uVar53] = (uchar)(uVar52 / 5);
                        uVar53 = uVar53 + 1;
                      } while (uVar29 != uVar53);
                      break;
                    default:
                      if (iVar61 < 0) goto LAB_00132ac5;
                      uVar53 = 0;
                      uVar52 = 0;
                      do {
                        bVar60 = puVar34[uVar53];
                        bVar3 = *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar53 & 7));
                        *(byte *)((long)&local_258[0].data +
                                 (ulong)((int)local_290 + (uint)uVar53 & 7)) = bVar60;
                        uVar52 = (ulong)((int)uVar52 + ((uint)bVar60 - (uint)bVar3));
                        puVar34[uVar53] = (uchar)(uVar52 / (local_410 & 0xffffffff));
                        uVar53 = uVar53 + 1;
                      } while (uVar29 != uVar53);
                    }
                    if ((int)uVar53 < (int)(uint)uVar17) {
                      uVar53 = uVar53 & 0xffffffff;
                      do {
                        if (puVar34[uVar53] != '\0') {
                          __assert_fail("pixels[i] == 0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imstb_truetype.h"
                                        ,0xf41,
                                        "void stbtt__h_prefilter(unsigned char *, int, int, int, unsigned int)"
                                       );
                        }
                        uVar49 = (int)uVar52 -
                                 (uint)*(byte *)((long)&local_258[0].data +
                                                (ulong)((uint)uVar53 & 7));
                        uVar52 = (ulong)uVar49;
                        puVar34[uVar53] = (uchar)(uVar49 / (uint)local_410);
                        uVar53 = uVar53 + 1;
                      } while ((int)uVar53 < (int)(uint)uVar17);
                    }
                    puVar34 = puVar34 + lVar32;
                    uVar26 = uVar26 + 1;
                  } while (uVar26 != uVar5);
                }
                bVar60 = (byte)local_408;
                atlas_00 = atlas_01;
              }
              if (1 < bVar60) {
                uVar17 = *(ushort *)(local_368 + 4);
                uVar26 = (uint)*(ushort *)(local_368 + 6);
                local_258[0].data = (uchar *)0x0;
                if (uVar17 != 0) {
                  pbVar48 = local_358 +
                            (ulong)*(ushort *)(local_368 + 10) * lVar32 +
                            (ulong)*(ushort *)(local_368 + 8);
                  iVar61 = uVar26 - (uint)local_408;
                  uVar29 = (ulong)(iVar61 + 1);
                  uVar49 = 0;
                  do {
                    uVar52 = local_408;
                    memset(local_258,0,local_408);
                    switch((int)uVar52) {
                    case 2:
                      if (iVar61 < 0) {
LAB_00132d63:
                        uVar53 = 0;
                        uVar52 = 0;
                      }
                      else {
                        uVar53 = 0;
                        uVar52 = 0;
                        pbVar54 = pbVar48;
                        do {
                          bVar60 = *pbVar54;
                          bVar3 = *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar53 & 7));
                          *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar53 + 2 & 7)) =
                               bVar60;
                          uVar58 = (int)uVar52 + ((uint)bVar60 - (uint)bVar3);
                          uVar52 = (ulong)uVar58;
                          *pbVar54 = (byte)(uVar58 >> 1);
                          uVar53 = uVar53 + 1;
                          pbVar54 = pbVar54 + lVar32;
                        } while (uVar29 != uVar53);
                      }
                      break;
                    case 3:
                      if (iVar61 < 0) goto LAB_00132d63;
                      uVar53 = 0;
                      uVar52 = 0;
                      pbVar54 = pbVar48;
                      do {
                        bVar60 = *pbVar54;
                        bVar3 = *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar53 & 7));
                        *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar53 + 3 & 7)) = bVar60
                        ;
                        uVar52 = (ulong)((int)uVar52 + ((uint)bVar60 - (uint)bVar3));
                        *pbVar54 = (byte)(uVar52 / 3);
                        uVar53 = uVar53 + 1;
                        pbVar54 = pbVar54 + lVar32;
                      } while (uVar29 != uVar53);
                      break;
                    case 4:
                      if (iVar61 < 0) goto LAB_00132d63;
                      uVar53 = 0;
                      uVar52 = 0;
                      pbVar54 = pbVar48;
                      do {
                        bVar60 = *pbVar54;
                        uVar46 = (ulong)((uint)uVar53 & 7);
                        bVar3 = *(byte *)((long)&local_258[0].data + uVar46);
                        *(byte *)((long)&local_258[0].data + (uVar46 ^ 4)) = bVar60;
                        uVar58 = (int)uVar52 + ((uint)bVar60 - (uint)bVar3);
                        uVar52 = (ulong)uVar58;
                        *pbVar54 = (byte)(uVar58 >> 2);
                        uVar53 = uVar53 + 1;
                        pbVar54 = pbVar54 + lVar32;
                      } while (uVar29 != uVar53);
                      break;
                    case 5:
                      if (iVar61 < 0) goto LAB_00132d63;
                      uVar53 = 0;
                      uVar52 = 0;
                      pbVar54 = pbVar48;
                      do {
                        bVar60 = *pbVar54;
                        bVar3 = *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar53 & 7));
                        *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar53 + 5 & 7)) = bVar60
                        ;
                        uVar52 = (ulong)((int)uVar52 + ((uint)bVar60 - (uint)bVar3));
                        *pbVar54 = (byte)(uVar52 / 5);
                        uVar53 = uVar53 + 1;
                        pbVar54 = pbVar54 + lVar32;
                      } while (uVar29 != uVar53);
                      break;
                    default:
                      if (iVar61 < 0) goto LAB_00132d63;
                      uVar53 = 0;
                      uVar52 = 0;
                      pbVar54 = pbVar48;
                      do {
                        bVar60 = *pbVar54;
                        bVar3 = *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar53 & 7));
                        *(byte *)((long)&local_258[0].data +
                                 (ulong)((int)local_298 + (uint)uVar53 & 7)) = bVar60;
                        uVar52 = (ulong)((int)uVar52 + ((uint)bVar60 - (uint)bVar3));
                        *pbVar54 = (byte)(uVar52 / (local_408 & 0xffffffff));
                        uVar53 = uVar53 + 1;
                        pbVar54 = pbVar54 + lVar32;
                      } while (uVar29 != uVar53);
                    }
                    iVar27 = (int)uVar53;
                    iVar57 = uVar26 - iVar27;
                    if (iVar57 != 0 && iVar27 <= (int)uVar26) {
                      lVar56 = (long)iVar27;
                      pbVar54 = pbVar48 + lVar32 * lVar56;
                      do {
                        if (*pbVar54 != 0) {
                          __assert_fail("pixels[i*stride_in_bytes] == 0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imstb_truetype.h"
                                        ,0xf7f,
                                        "void stbtt__v_prefilter(unsigned char *, int, int, int, unsigned int)"
                                       );
                        }
                        uVar58 = (int)uVar52 -
                                 (uint)*(byte *)((long)&local_258[0].data +
                                                (ulong)((uint)lVar56 & 7));
                        uVar52 = (ulong)uVar58;
                        *pbVar54 = (byte)(uVar58 / (uint)local_408);
                        lVar56 = lVar56 + 1;
                        pbVar54 = pbVar54 + lVar32;
                        iVar57 = iVar57 + -1;
                      } while (iVar57 != 0);
                    }
                    pbVar48 = pbVar48 + 1;
                    uVar49 = uVar49 + 1;
                  } while (uVar49 != uVar17);
                }
              }
              sVar18 = (short)*(undefined4 *)(local_368 + 8);
              *local_2a8 = sVar18;
              sVar38 = *(short *)(local_368 + 10);
              local_2a8[1] = sVar38;
              uVar17 = *(ushort *)(local_368 + 4);
              local_2a8[2] = sVar18 + uVar17;
              uVar5 = *(ushort *)(local_368 + 6);
              local_2a8[3] = sVar38 + uVar5;
              *(float *)(local_2a8 + 8) =
                   (float)(int)(short)((short)(local_314 << 8) + (short)local_318) * local_2d8;
              *(float *)(local_2a8 + 4) = (float)local_300 * local_31c + local_380;
              *(float *)(local_2a8 + 6) = (float)local_304 * local_320 + local_37c;
              *(float *)(local_2a8 + 10) =
                   (float)(int)(local_300 + (uint)uVar17) * local_31c + local_380;
              *(float *)(local_2a8 + 0xc) =
                   (float)(int)(local_304 + (uint)uVar5) * local_320 + local_37c;
              lVar64 = local_2a0;
              lVar56 = local_2b0;
              psVar63 = local_390;
              fVar71 = local_37c;
              fVar74 = local_380;
              atlas_01 = atlas_00;
            }
            lVar64 = lVar64 + 1;
          } while (lVar64 < psVar63[1].fontstart);
        }
        fVar67 = local_2b8[local_370].RasterizerMultiply;
        if ((fVar67 != 1.0) || (NAN(fVar67))) {
          lVar56 = 0;
          do {
            uVar26 = (uint)(long)((float)(int)lVar56 * fVar67);
            if (0xfe < uVar26) {
              uVar26 = 0xff;
            }
            *(char *)((long)&local_258[0].data + lVar56) = (char)uVar26;
            lVar56 = lVar56 + 1;
          } while (lVar56 != 0x100);
          psVar63 = local_390;
          if (0 < local_390[1].cff.cursor) {
            lVar64._0_4_ = local_390[1].hmtx;
            lVar64._4_4_ = local_390[1].kern;
            iVar61 = 0;
            do {
              if ((*(int *)(lVar64 + 0xc) != 0) && (*(ushort *)(lVar64 + 6) != 0)) {
                uVar17 = *(ushort *)(lVar64 + 4);
                iVar27 = atlas_00->TexWidth;
                puVar34 = atlas_00->TexPixelsAlpha8 +
                          (ulong)*(ushort *)(lVar64 + 10) * (long)iVar27 +
                          (ulong)*(ushort *)(lVar64 + 8);
                uVar26 = (uint)*(ushort *)(lVar64 + 6);
                do {
                  if ((ulong)uVar17 != 0) {
                    uVar29 = 0;
                    do {
                      puVar34[uVar29] =
                           *(uchar *)((long)&local_258[0].data + (ulong)puVar34[uVar29]);
                      uVar29 = uVar29 + 1;
                    } while (uVar17 != uVar29);
                  }
                  puVar34 = puVar34 + iVar27;
                  bVar16 = 1 < (int)uVar26;
                  uVar26 = uVar26 - 1;
                } while (bVar16);
              }
              iVar61 = iVar61 + 1;
              lVar64 = lVar64 + 0x10;
            } while (iVar61 < local_390[1].cff.cursor);
          }
        }
        psVar63[1].hmtx = 0;
        psVar63[1].kern = 0;
      }
      lVar56 = local_370 + 1;
    } while (lVar56 != lVar40);
  }
  ImGui::MemFree(local_3d0);
  ImGui::MemFree(local_2e8);
  ptr = local_438._8_8_;
  if ((void *)local_438._8_8_ != (void *)0x0) {
    auVar13._8_8_ = 0;
    auVar13._0_8_ = local_438._8_8_;
    local_438 = auVar13 << 0x40;
    ImGui::MemFree((void *)ptr);
    local_438._8_8_ = 0;
  }
  if (0 < (int)uVar6) {
    lVar56 = 0;
    do {
      lVar32 = lVar56 * 0x110;
      if (*(int *)((long)local_490 + lVar32 + 0xe8) != 0) {
        if ((atlas_01->ConfigData).Size <= lVar56) goto LAB_0013354a;
        lVar64 = *(long *)((long)local_490 + lVar32 + 8);
        lVar45 = (long)*(int *)((long)local_490 + lVar32 + 0x24);
        uVar26 = (int)(short)((ushort)*(byte *)(lVar64 + 4 + lVar45) << 8) |
                 (uint)*(byte *)(lVar64 + 5 + lVar45);
        uVar69 = 0xbf800000;
        if (0 < (short)uVar26) {
          uVar69 = 0x3f800000;
        }
        local_428._0_4_ = uVar69;
        uVar49 = (int)(short)((ushort)*(byte *)(lVar64 + 6 + lVar45) << 8) |
                 (uint)*(byte *)(lVar64 + 7 + lVar45);
        local_478 = -1.0;
        if (0 < (short)uVar49) {
          local_478 = 1.0;
        }
        pIVar10 = (atlas_01->ConfigData).Data;
        pIVar55 = pIVar10 + lVar56;
        pIVar7 = pIVar10[lVar56].DstFont;
        if (pIVar10[lVar56].MergeMode == false) {
          fVar67 = pIVar10[lVar56].SizePixels;
          ImFont::ClearOutputData(pIVar7);
          fVar67 = fVar67 / (float)(int)(uVar26 - uVar49);
          pIVar7->FontSize = pIVar55->SizePixels;
          pIVar7->ConfigData = pIVar55;
          pIVar7->ContainerAtlas = atlas_01;
          pIVar7->Ascent = (float)(int)((float)(int)uVar26 * fVar67 + (float)local_428._0_4_);
          pIVar7->Descent = (float)(int)((float)(int)uVar49 * fVar67 + local_478);
        }
        pIVar7->ConfigDataCount = pIVar7->ConfigDataCount + 1;
        if (0 < *(int *)((long)local_490 + lVar32 + 0xe8)) {
          fVar67 = (pIVar55->GlyphOffset).x;
          local_428 = ZEXT416((uint)((float)(int)(pIVar7->Ascent + 0.5) + (pIVar55->GlyphOffset).y))
          ;
          lVar45 = 0;
          lVar64 = 0;
          do {
            if (*(int *)((long)local_490 + lVar32 + 0x100) <= lVar64) goto LAB_001334ce;
            lVar11 = *(long *)((long)local_490 + lVar32 + 0xd0);
            fVar74 = *(float *)(lVar11 + 0x10 + lVar45);
            fVar71 = pIVar55->GlyphMaxAdvanceX;
            if (fVar74 <= pIVar55->GlyphMaxAdvanceX) {
              fVar71 = fVar74;
            }
            uVar26 = -(uint)(fVar74 < pIVar55->GlyphMinAdvanceX);
            fVar71 = (float)(uVar26 & (uint)pIVar55->GlyphMinAdvanceX | ~uVar26 & (uint)fVar71);
            if ((fVar74 != fVar71) || (fVar68 = fVar67, NAN(fVar74) || NAN(fVar71))) {
              fVar68 = (fVar71 - fVar74) * 0.5;
              if (pIVar55->PixelSnapH != false) {
                fVar68 = (float)(int)fVar68;
              }
              fVar68 = fVar68 + fVar67;
            }
            fVar73 = 1.0 / (float)atlas_01->TexHeight;
            fVar74 = 1.0 / (float)atlas_01->TexWidth;
            ImFont::AddGlyph(pIVar7,(ImWchar)*(undefined4 *)
                                              (*(long *)((long)local_490 + lVar32 + 0x108) +
                                              lVar64 * 4),
                             *(float *)(lVar11 + 8 + lVar45) + 0.0 + fVar68,
                             *(float *)(lVar11 + 0xc + lVar45) + 0.0 + (float)local_428._0_4_,
                             *(float *)(lVar11 + 0x14 + lVar45) + 0.0 + fVar68,
                             *(float *)(lVar11 + 0x18 + lVar45) + 0.0 + (float)local_428._0_4_,
                             (float)*(ushort *)(lVar11 + lVar45) * fVar74,
                             (float)*(ushort *)(lVar11 + 2 + lVar45) * fVar73,
                             (float)*(ushort *)(lVar11 + 4 + lVar45) * fVar74,
                             (float)*(ushort *)(lVar11 + 6 + lVar45) * fVar73,fVar71);
            lVar64 = lVar64 + 1;
            lVar45 = lVar45 + 0x1c;
          } while (lVar64 < *(int *)((long)local_490 + lVar32 + 0xe8));
        }
      }
      lVar56 = lVar56 + 1;
    } while (lVar56 != lVar40);
  }
  sVar15 = local_2c0;
  if (0 < (int)uVar6) {
    sVar47 = 0;
    do {
      pvVar33 = *(void **)((long)local_490 + sVar47 + 0x108);
      if (pvVar33 != (void *)0x0) {
        ImGui::MemFree(pvVar33);
      }
      pvVar33 = *(void **)((long)local_490 + sVar47 + 0xf8);
      if (pvVar33 != (void *)0x0) {
        ImGui::MemFree(pvVar33);
      }
      sVar47 = sVar47 + 0x110;
    } while (sVar15 != sVar47);
  }
  ImFontAtlasBuildFinish(atlas_01);
  if (pvStack_3e0 != (void *)0x0) {
    ImGui::MemFree(pvStack_3e0);
  }
  if ((void *)local_438._8_8_ != (void *)0x0) {
    ImGui::MemFree((void *)local_438._8_8_);
  }
LAB_001333bc:
  bVar60 = (byte)((uint)iVar79 >> 0x18);
  if (local_3f8 != (void *)0x0) {
    ImGui::MemFree(local_3f8);
  }
  if (local_490 != (void *)0x0) {
    ImGui::MemFree(local_490);
  }
  return (bool)(bVar60 & 1);
LAB_00133561:
  __function = "T &ImVector<ImFontBuildDstData>::operator[](int) [T = ImFontBuildDstData]";
  goto LAB_001334e3;
LAB_0013354a:
  __function = "T &ImVector<ImFontConfig>::operator[](int) [T = ImFontConfig]";
  goto LAB_001334e3;
LAB_001334ce:
  __function = "T &ImVector<int>::operator[](int) [T = int]";
LAB_001334e3:
  __assert_fail("i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui.h"
                ,0x52e,__function);
}

Assistant:

bool    ImFontAtlasBuildWithStbTruetype(ImFontAtlas* atlas)
{
    IM_ASSERT(atlas->ConfigData.Size > 0);

    ImFontAtlasBuildInit(atlas);

    // Clear atlas
    atlas->TexID = (ImTextureID)NULL;
    atlas->TexWidth = atlas->TexHeight = 0;
    atlas->TexUvScale = ImVec2(0.0f, 0.0f);
    atlas->TexUvWhitePixel = ImVec2(0.0f, 0.0f);
    atlas->ClearTexData();

    // Temporary storage for building
    ImVector<ImFontBuildSrcData> src_tmp_array;
    ImVector<ImFontBuildDstData> dst_tmp_array;
    src_tmp_array.resize(atlas->ConfigData.Size);
    dst_tmp_array.resize(atlas->Fonts.Size);
    memset(src_tmp_array.Data, 0, (size_t)src_tmp_array.size_in_bytes());
    memset(dst_tmp_array.Data, 0, (size_t)dst_tmp_array.size_in_bytes());

    // 1. Initialize font loading structure, check font data validity
    for (int src_i = 0; src_i < atlas->ConfigData.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        IM_ASSERT(cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas));

        // Find index from cfg.DstFont (we allow the user to set cfg.DstFont. Also it makes casual debugging nicer than when storing indices)
        src_tmp.DstIndex = -1;
        for (int output_i = 0; output_i < atlas->Fonts.Size && src_tmp.DstIndex == -1; output_i++)
            if (cfg.DstFont == atlas->Fonts[output_i])
                src_tmp.DstIndex = output_i;
        IM_ASSERT(src_tmp.DstIndex != -1); // cfg.DstFont not pointing within atlas->Fonts[] array?
        if (src_tmp.DstIndex == -1)
            return false;

        // Initialize helper structure for font loading and verify that the TTF/OTF data is correct
        const int font_offset = stbtt_GetFontOffsetForIndex((unsigned char*)cfg.FontData, cfg.FontNo);
        IM_ASSERT(font_offset >= 0 && "FontData is incorrect, or FontNo cannot be found.");
        if (!stbtt_InitFont(&src_tmp.FontInfo, (unsigned char*)cfg.FontData, font_offset))
            return false;

        // Measure highest codepoints
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.SrcRanges = cfg.GlyphRanges ? cfg.GlyphRanges : atlas->GetGlyphRangesDefault();
        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            src_tmp.GlyphsHighest = ImMax(src_tmp.GlyphsHighest, (int)src_range[1]);
        dst_tmp.SrcCount++;
        dst_tmp.GlyphsHighest = ImMax(dst_tmp.GlyphsHighest, src_tmp.GlyphsHighest);
    }

    // 2. For every requested codepoint, check for their presence in the font data, and handle redundancy or overlaps between source fonts to avoid unused glyphs.
    int total_glyphs_count = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.GlyphsSet.Create(src_tmp.GlyphsHighest + 1);
        if (dst_tmp.GlyphsSet.Storage.empty())
            dst_tmp.GlyphsSet.Create(dst_tmp.GlyphsHighest + 1);

        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            for (unsigned int codepoint = src_range[0]; codepoint <= src_range[1]; codepoint++)
            {
                if (dst_tmp.GlyphsSet.TestBit(codepoint))    // Don't overwrite existing glyphs. We could make this an option for MergeMode (e.g. MergeOverwrite==true)
                    continue;
                if (!stbtt_FindGlyphIndex(&src_tmp.FontInfo, codepoint))    // It is actually in the font?
                    continue;

                // Add to avail set/counters
                src_tmp.GlyphsCount++;
                dst_tmp.GlyphsCount++;
                src_tmp.GlyphsSet.SetBit(codepoint);
                dst_tmp.GlyphsSet.SetBit(codepoint);
                total_glyphs_count++;
            }
    }

    // 3. Unpack our bit map into a flat list (we now have all the Unicode points that we know are requested _and_ available _and_ not overlapping another)
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        src_tmp.GlyphsList.reserve(src_tmp.GlyphsCount);
        UnpackBitVectorToFlatIndexList(&src_tmp.GlyphsSet, &src_tmp.GlyphsList);
        src_tmp.GlyphsSet.Clear();
        IM_ASSERT(src_tmp.GlyphsList.Size == src_tmp.GlyphsCount);
    }
    for (int dst_i = 0; dst_i < dst_tmp_array.Size; dst_i++)
        dst_tmp_array[dst_i].GlyphsSet.Clear();
    dst_tmp_array.clear();

    // Allocate packing character data and flag packed characters buffer as non-packed (x0=y0=x1=y1=0)
    // (We technically don't need to zero-clear buf_rects, but let's do it for the sake of sanity)
    ImVector<stbrp_rect> buf_rects;
    ImVector<stbtt_packedchar> buf_packedchars;
    buf_rects.resize(total_glyphs_count);
    buf_packedchars.resize(total_glyphs_count);
    memset(buf_rects.Data, 0, (size_t)buf_rects.size_in_bytes());
    memset(buf_packedchars.Data, 0, (size_t)buf_packedchars.size_in_bytes());

    // 4. Gather glyphs sizes so we can pack them in our virtual canvas.
    int total_surface = 0;
    int buf_rects_out_n = 0;
    int buf_packedchars_out_n = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        src_tmp.Rects = &buf_rects[buf_rects_out_n];
        src_tmp.PackedChars = &buf_packedchars[buf_packedchars_out_n];
        buf_rects_out_n += src_tmp.GlyphsCount;
        buf_packedchars_out_n += src_tmp.GlyphsCount;

        // Convert our ranges in the format stb_truetype wants
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        src_tmp.PackRange.font_size = cfg.SizePixels;
        src_tmp.PackRange.first_unicode_codepoint_in_range = 0;
        src_tmp.PackRange.array_of_unicode_codepoints = src_tmp.GlyphsList.Data;
        src_tmp.PackRange.num_chars = src_tmp.GlyphsList.Size;
        src_tmp.PackRange.chardata_for_range = src_tmp.PackedChars;
        src_tmp.PackRange.h_oversample = (unsigned char)cfg.OversampleH;
        src_tmp.PackRange.v_oversample = (unsigned char)cfg.OversampleV;

        // Gather the sizes of all rectangles we will need to pack (this loop is based on stbtt_PackFontRangesGatherRects)
        const float scale = (cfg.SizePixels > 0) ? stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels) : stbtt_ScaleForMappingEmToPixels(&src_tmp.FontInfo, -cfg.SizePixels);
        const int padding = atlas->TexGlyphPadding;
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsList.Size; glyph_i++)
        {
            int x0, y0, x1, y1;
            const int glyph_index_in_font = stbtt_FindGlyphIndex(&src_tmp.FontInfo, src_tmp.GlyphsList[glyph_i]);
            IM_ASSERT(glyph_index_in_font != 0);
            stbtt_GetGlyphBitmapBoxSubpixel(&src_tmp.FontInfo, glyph_index_in_font, scale * cfg.OversampleH, scale * cfg.OversampleV, 0, 0, &x0, &y0, &x1, &y1);
            src_tmp.Rects[glyph_i].w = (stbrp_coord)(x1 - x0 + padding + cfg.OversampleH - 1);
            src_tmp.Rects[glyph_i].h = (stbrp_coord)(y1 - y0 + padding + cfg.OversampleV - 1);
            total_surface += src_tmp.Rects[glyph_i].w * src_tmp.Rects[glyph_i].h;
        }
    }

    // We need a width for the skyline algorithm, any width!
    // The exact width doesn't really matter much, but some API/GPU have texture size limitations and increasing width can decrease height.
    // User can override TexDesiredWidth and TexGlyphPadding if they wish, otherwise we use a simple heuristic to select the width based on expected surface.
    const int surface_sqrt = (int)ImSqrt((float)total_surface) + 1;
    atlas->TexHeight = 0;
    if (atlas->TexDesiredWidth > 0)
        atlas->TexWidth = atlas->TexDesiredWidth;
    else
        atlas->TexWidth = (surface_sqrt >= 4096*0.7f) ? 4096 : (surface_sqrt >= 2048*0.7f) ? 2048 : (surface_sqrt >= 1024*0.7f) ? 1024 : 512;

    // 5. Start packing
    // Pack our extra data rectangles first, so it will be on the upper-left corner of our texture (UV will have small values).
    const int TEX_HEIGHT_MAX = 1024 * 32;
    stbtt_pack_context spc = {};
    stbtt_PackBegin(&spc, NULL, atlas->TexWidth, TEX_HEIGHT_MAX, 0, atlas->TexGlyphPadding, NULL);
    ImFontAtlasBuildPackCustomRects(atlas, spc.pack_info);

    // 6. Pack each source font. No rendering yet, we are working with rectangles in an infinitely tall texture at this point.
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbrp_pack_rects((stbrp_context*)spc.pack_info, src_tmp.Rects, src_tmp.GlyphsCount);

        // Extend texture height and mark missing glyphs as non-packed so we won't render them.
        // FIXME: We are not handling packing failure here (would happen if we got off TEX_HEIGHT_MAX or if a single if larger than TexWidth?)
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
            if (src_tmp.Rects[glyph_i].was_packed)
                atlas->TexHeight = ImMax(atlas->TexHeight, src_tmp.Rects[glyph_i].y + src_tmp.Rects[glyph_i].h);
    }

    // 7. Allocate texture
    atlas->TexHeight = (atlas->Flags & ImFontAtlasFlags_NoPowerOfTwoHeight) ? (atlas->TexHeight + 1) : ImUpperPowerOfTwo(atlas->TexHeight);
    atlas->TexUvScale = ImVec2(1.0f / atlas->TexWidth, 1.0f / atlas->TexHeight);
    atlas->TexPixelsAlpha8 = (unsigned char*)IM_ALLOC(atlas->TexWidth * atlas->TexHeight);
    memset(atlas->TexPixelsAlpha8, 0, atlas->TexWidth * atlas->TexHeight);
    spc.pixels = atlas->TexPixelsAlpha8;
    spc.height = atlas->TexHeight;

    // 8. Render/rasterize font characters into the texture
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbtt_PackFontRangesRenderIntoRects(&spc, &src_tmp.FontInfo, &src_tmp.PackRange, 1, src_tmp.Rects);

        // Apply multiply operator
        if (cfg.RasterizerMultiply != 1.0f)
        {
            unsigned char multiply_table[256];
            ImFontAtlasBuildMultiplyCalcLookupTable(multiply_table, cfg.RasterizerMultiply);
            stbrp_rect* r = &src_tmp.Rects[0];
            for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++, r++)
                if (r->was_packed)
                    ImFontAtlasBuildMultiplyRectAlpha8(multiply_table, atlas->TexPixelsAlpha8, r->x, r->y, r->w, r->h, atlas->TexWidth * 1);
        }
        src_tmp.Rects = NULL;
    }

    // End packing
    stbtt_PackEnd(&spc);
    buf_rects.clear();

    // 9. Setup ImFont and glyphs for runtime
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFont* dst_font = cfg.DstFont; // We can have multiple input fonts writing into a same destination font (when using MergeMode=true)

        const float font_scale = stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels);
        int unscaled_ascent, unscaled_descent, unscaled_line_gap;
        stbtt_GetFontVMetrics(&src_tmp.FontInfo, &unscaled_ascent, &unscaled_descent, &unscaled_line_gap);

        const float ascent = ImFloor(unscaled_ascent * font_scale + ((unscaled_ascent > 0.0f) ? +1 : -1));
        const float descent = ImFloor(unscaled_descent * font_scale + ((unscaled_descent > 0.0f) ? +1 : -1));
        ImFontAtlasBuildSetupFont(atlas, dst_font, &cfg, ascent, descent);
        const float font_off_x = cfg.GlyphOffset.x;
        const float font_off_y = cfg.GlyphOffset.y + IM_ROUND(dst_font->Ascent);

        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
        {
            const int codepoint = src_tmp.GlyphsList[glyph_i];
            const stbtt_packedchar& pc = src_tmp.PackedChars[glyph_i];

            const float char_advance_x_org = pc.xadvance;
            const float char_advance_x_mod = ImClamp(char_advance_x_org, cfg.GlyphMinAdvanceX, cfg.GlyphMaxAdvanceX);
            float char_off_x = font_off_x;
            if (char_advance_x_org != char_advance_x_mod)
                char_off_x += cfg.PixelSnapH ? ImFloor((char_advance_x_mod - char_advance_x_org) * 0.5f) : (char_advance_x_mod - char_advance_x_org) * 0.5f;

            // Register glyph
            stbtt_aligned_quad q;
            float dummy_x = 0.0f, dummy_y = 0.0f;
            stbtt_GetPackedQuad(src_tmp.PackedChars, atlas->TexWidth, atlas->TexHeight, glyph_i, &dummy_x, &dummy_y, &q, 0);
            dst_font->AddGlyph((ImWchar)codepoint, q.x0 + char_off_x, q.y0 + font_off_y, q.x1 + char_off_x, q.y1 + font_off_y, q.s0, q.t0, q.s1, q.t1, char_advance_x_mod);
        }
    }

    // Cleanup temporary (ImVector doesn't honor destructor)
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
        src_tmp_array[src_i].~ImFontBuildSrcData();

    ImFontAtlasBuildFinish(atlas);
    return true;
}